

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined6 uVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  int iVar40;
  undefined4 uVar41;
  ulong uVar42;
  long lVar43;
  undefined4 uVar47;
  RTCFilterFunctionN p_Var44;
  undefined8 uVar45;
  undefined1 (*pauVar46) [16];
  ulong uVar48;
  ulong uVar49;
  bool bVar50;
  int iVar51;
  bool bVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  short sVar58;
  float fVar59;
  float fVar102;
  float fVar103;
  vfloat4 a;
  undefined2 uVar101;
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar104;
  float fVar124;
  float fVar125;
  vfloat4 v;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar127;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar141;
  float fVar153;
  float fVar154;
  vfloat4 v_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar155;
  float fVar166;
  float fVar167;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  float fVar168;
  float fVar183;
  float fVar184;
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar185;
  float fVar195;
  float fVar196;
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar220;
  float fVar221;
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar222;
  float fVar230;
  float fVar231;
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar232;
  float fVar241;
  float fVar242;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar243;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar244 [16];
  float fVar249;
  float fVar250;
  float fVar254;
  float fVar256;
  float fVar258;
  undefined1 auVar251 [16];
  float fVar255;
  float fVar257;
  float fVar259;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  __m128 a_2;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar283 [8];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar290 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  int local_5bc;
  undefined4 uStack_564;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined4 local_50c;
  RTCFilterFunctionNArguments local_508;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined8 local_488;
  float fStack_480;
  float fStack_47c;
  undefined4 local_478;
  undefined4 local_474;
  uint local_470;
  uint local_46c;
  uint local_468;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  Primitive *local_368;
  ulong local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 uVar100;
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar179 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar289 [16];
  
  PVar6 = prim[1];
  uVar49 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar49 * 0x19 + 6;
  fVar125 = *(float *)(pPVar5 + 0xc);
  fVar141 = ((ray->org).field_0.m128[0] - *(float *)pPVar5) * fVar125;
  fVar153 = ((ray->org).field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar125;
  fVar154 = ((ray->org).field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar125;
  fVar104 = fVar125 * (ray->dir).field_0.m128[0];
  fVar124 = fVar125 * (ray->dir).field_0.m128[1];
  fVar125 = fVar125 * (ray->dir).field_0.m128[2];
  uVar47 = *(undefined4 *)(prim + uVar49 * 4 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar45 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar45 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar48 = CONCAT62(uVar24,sVar58);
  auVar234._8_4_ = 0;
  auVar234._0_8_ = uVar48;
  auVar234._12_2_ = uVar101;
  auVar234._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar45 >> 0x20);
  auVar174._12_4_ = auVar234._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar48;
  auVar174._10_2_ = uVar101;
  auVar236._10_6_ = auVar174._10_6_;
  auVar236._8_2_ = uVar101;
  auVar236._0_8_ = uVar48;
  uVar101 = (undefined2)uVar24;
  auVar25._4_8_ = auVar236._8_8_;
  auVar25._2_2_ = uVar101;
  auVar25._0_2_ = uVar101;
  fVar126 = (float)((int)sVar58 >> 8);
  fVar138 = (float)(auVar25._0_4_ >> 0x18);
  fVar139 = (float)(auVar236._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar49 * 5 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar45 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar45 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar48 = CONCAT62(uVar24,sVar58);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar48;
  auVar62._12_2_ = uVar101;
  auVar62._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar45 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar48;
  auVar61._10_2_ = uVar101;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar101;
  auVar60._0_8_ = uVar48;
  uVar101 = (undefined2)uVar24;
  auVar26._4_8_ = auVar60._8_8_;
  auVar26._2_2_ = uVar101;
  auVar26._0_2_ = uVar101;
  fVar155 = (float)((int)sVar58 >> 8);
  fVar166 = (float)(auVar26._0_4_ >> 0x18);
  fVar167 = (float)(auVar60._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar49 * 6 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar45 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar45 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar48 = CONCAT62(uVar24,sVar58);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar48;
  auVar65._12_2_ = uVar101;
  auVar65._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar45 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar48;
  auVar64._10_2_ = uVar101;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar101;
  auVar63._0_8_ = uVar48;
  uVar101 = (undefined2)uVar24;
  auVar27._4_8_ = auVar63._8_8_;
  auVar27._2_2_ = uVar101;
  auVar27._0_2_ = uVar101;
  fVar168 = (float)((int)sVar58 >> 8);
  fVar183 = (float)(auVar27._0_4_ >> 0x18);
  fVar184 = (float)(auVar63._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar49 * 0xb + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar45 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar45 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar48 = CONCAT62(uVar24,sVar58);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar48;
  auVar68._12_2_ = uVar101;
  auVar68._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar45 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar48;
  auVar67._10_2_ = uVar101;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar101;
  auVar66._0_8_ = uVar48;
  uVar101 = (undefined2)uVar24;
  auVar28._4_8_ = auVar66._8_8_;
  auVar28._2_2_ = uVar101;
  auVar28._0_2_ = uVar101;
  fVar59 = (float)((int)sVar58 >> 8);
  fVar102 = (float)(auVar28._0_4_ >> 0x18);
  fVar103 = (float)(auVar66._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar45 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar45 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar48 = CONCAT62(uVar24,sVar58);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar48;
  auVar188._12_2_ = uVar101;
  auVar188._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar45 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar48;
  auVar187._10_2_ = uVar101;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar101;
  auVar186._0_8_ = uVar48;
  uVar101 = (undefined2)uVar24;
  auVar29._4_8_ = auVar186._8_8_;
  auVar29._2_2_ = uVar101;
  auVar29._0_2_ = uVar101;
  fVar185 = (float)((int)sVar58 >> 8);
  fVar195 = (float)(auVar29._0_4_ >> 0x18);
  fVar196 = (float)(auVar186._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar49 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar45 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar45 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar48 = CONCAT62(uVar24,sVar58);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar48;
  auVar200._12_2_ = uVar101;
  auVar200._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar45 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar48;
  auVar199._10_2_ = uVar101;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar101;
  auVar198._0_8_ = uVar48;
  uVar101 = (undefined2)uVar24;
  auVar30._4_8_ = auVar198._8_8_;
  auVar30._2_2_ = uVar101;
  auVar30._0_2_ = uVar101;
  fVar232 = (float)((int)sVar58 >> 8);
  fVar241 = (float)(auVar30._0_4_ >> 0x18);
  fVar242 = (float)(auVar198._8_4_ >> 0x18);
  uVar42 = (ulong)(uint)((int)(uVar49 * 9) * 2);
  uVar47 = *(undefined4 *)(prim + uVar42 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar45 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar45 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar48 = CONCAT62(uVar24,sVar58);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar48;
  auVar203._12_2_ = uVar101;
  auVar203._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar45 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar48;
  auVar202._10_2_ = uVar101;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar101;
  auVar201._0_8_ = uVar48;
  uVar101 = (undefined2)uVar24;
  auVar31._4_8_ = auVar201._8_8_;
  auVar31._2_2_ = uVar101;
  auVar31._0_2_ = uVar101;
  fVar222 = (float)((int)sVar58 >> 8);
  fVar230 = (float)(auVar31._0_4_ >> 0x18);
  fVar231 = (float)(auVar201._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar42 + uVar49 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar45 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar45 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar48 = CONCAT62(uVar24,sVar58);
  auVar206._8_4_ = 0;
  auVar206._0_8_ = uVar48;
  auVar206._12_2_ = uVar101;
  auVar206._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar45 >> 0x20);
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar48;
  auVar205._10_2_ = uVar101;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._8_2_ = uVar101;
  auVar204._0_8_ = uVar48;
  uVar101 = (undefined2)uVar24;
  auVar32._4_8_ = auVar204._8_8_;
  auVar32._2_2_ = uVar101;
  auVar32._0_2_ = uVar101;
  fVar243 = (float)((int)sVar58 >> 8);
  fVar245 = (float)(auVar32._0_4_ >> 0x18);
  fVar246 = (float)(auVar204._8_4_ >> 0x18);
  uVar42 = (ulong)(uint)((int)(uVar49 * 5) << 2);
  uVar47 = *(undefined4 *)(prim + uVar42 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar45 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar45 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar48 = CONCAT62(uVar24,sVar58);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar48;
  auVar209._12_2_ = uVar101;
  auVar209._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar45 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar48;
  auVar208._10_2_ = uVar101;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar101;
  auVar207._0_8_ = uVar48;
  uVar101 = (undefined2)uVar24;
  auVar33._4_8_ = auVar207._8_8_;
  auVar33._2_2_ = uVar101;
  auVar33._0_2_ = uVar101;
  fVar268 = (float)((int)sVar58 >> 8);
  fVar274 = (float)(auVar33._0_4_ >> 0x18);
  fVar276 = (float)(auVar207._8_4_ >> 0x18);
  fVar260 = fVar104 * fVar126 + fVar124 * fVar155 + fVar125 * fVar168;
  fVar262 = fVar104 * fVar138 + fVar124 * fVar166 + fVar125 * fVar183;
  fVar264 = fVar104 * fVar139 + fVar124 * fVar167 + fVar125 * fVar184;
  fVar266 = fVar104 * (float)(auVar174._12_4_ >> 0x18) +
            fVar124 * (float)(auVar61._12_4_ >> 0x18) + fVar125 * (float)(auVar64._12_4_ >> 0x18);
  fVar249 = fVar104 * fVar59 + fVar124 * fVar185 + fVar125 * fVar232;
  fVar254 = fVar104 * fVar102 + fVar124 * fVar195 + fVar125 * fVar241;
  fVar256 = fVar104 * fVar103 + fVar124 * fVar196 + fVar125 * fVar242;
  fVar258 = fVar104 * (float)(auVar67._12_4_ >> 0x18) +
            fVar124 * (float)(auVar187._12_4_ >> 0x18) + fVar125 * (float)(auVar199._12_4_ >> 0x18);
  fVar197 = fVar104 * fVar222 + fVar124 * fVar243 + fVar125 * fVar268;
  fVar220 = fVar104 * fVar230 + fVar124 * fVar245 + fVar125 * fVar274;
  fVar221 = fVar104 * fVar231 + fVar124 * fVar246 + fVar125 * fVar276;
  fVar104 = fVar104 * (float)(auVar202._12_4_ >> 0x18) +
            fVar124 * (float)(auVar205._12_4_ >> 0x18) + fVar125 * (float)(auVar208._12_4_ >> 0x18);
  fVar127 = fVar126 * fVar141 + fVar155 * fVar153 + fVar168 * fVar154;
  fVar183 = fVar138 * fVar141 + fVar166 * fVar153 + fVar183 * fVar154;
  fVar184 = fVar139 * fVar141 + fVar167 * fVar153 + fVar184 * fVar154;
  fVar140 = (float)(auVar174._12_4_ >> 0x18) * fVar141 +
            (float)(auVar61._12_4_ >> 0x18) * fVar153 + (float)(auVar64._12_4_ >> 0x18) * fVar154;
  fVar185 = fVar59 * fVar141 + fVar185 * fVar153 + fVar232 * fVar154;
  fVar195 = fVar102 * fVar141 + fVar195 * fVar153 + fVar241 * fVar154;
  fVar196 = fVar103 * fVar141 + fVar196 * fVar153 + fVar242 * fVar154;
  fVar232 = (float)(auVar67._12_4_ >> 0x18) * fVar141 +
            (float)(auVar187._12_4_ >> 0x18) * fVar153 + (float)(auVar199._12_4_ >> 0x18) * fVar154;
  fVar155 = fVar141 * fVar222 + fVar153 * fVar243 + fVar154 * fVar268;
  fVar166 = fVar141 * fVar230 + fVar153 * fVar245 + fVar154 * fVar274;
  fVar167 = fVar141 * fVar231 + fVar153 * fVar246 + fVar154 * fVar276;
  fVar168 = fVar141 * (float)(auVar202._12_4_ >> 0x18) +
            fVar153 * (float)(auVar205._12_4_ >> 0x18) + fVar154 * (float)(auVar208._12_4_ >> 0x18);
  fVar125 = (float)DAT_01f80d30;
  fVar59 = DAT_01f80d30._4_4_;
  fVar102 = DAT_01f80d30._8_4_;
  fVar103 = DAT_01f80d30._12_4_;
  uVar53 = -(uint)(fVar125 <= ABS(fVar260));
  uVar54 = -(uint)(fVar59 <= ABS(fVar262));
  uVar55 = -(uint)(fVar102 <= ABS(fVar264));
  uVar56 = -(uint)(fVar103 <= ABS(fVar266));
  auVar142._0_4_ = ~uVar53 & (uint)fVar125;
  auVar142._4_4_ = ~uVar54 & (uint)fVar59;
  auVar142._8_4_ = ~uVar55 & (uint)fVar102;
  auVar142._12_4_ = ~uVar56 & (uint)fVar103;
  auVar69._4_4_ = (uint)fVar262 & uVar54;
  auVar69._0_4_ = (uint)fVar260 & uVar53;
  auVar69._8_4_ = (uint)fVar264 & uVar55;
  auVar69._12_4_ = (uint)fVar266 & uVar56;
  auVar142 = auVar142 | auVar69;
  uVar53 = -(uint)(fVar125 <= ABS(fVar249));
  uVar54 = -(uint)(fVar59 <= ABS(fVar254));
  uVar55 = -(uint)(fVar102 <= ABS(fVar256));
  uVar56 = -(uint)(fVar103 <= ABS(fVar258));
  auVar251._0_4_ = (uint)fVar249 & uVar53;
  auVar251._4_4_ = (uint)fVar254 & uVar54;
  auVar251._8_4_ = (uint)fVar256 & uVar55;
  auVar251._12_4_ = (uint)fVar258 & uVar56;
  auVar156._0_4_ = ~uVar53 & (uint)fVar125;
  auVar156._4_4_ = ~uVar54 & (uint)fVar59;
  auVar156._8_4_ = ~uVar55 & (uint)fVar102;
  auVar156._12_4_ = ~uVar56 & (uint)fVar103;
  auVar156 = auVar156 | auVar251;
  uVar53 = -(uint)(fVar125 <= ABS(fVar197));
  uVar54 = -(uint)(fVar59 <= ABS(fVar220));
  uVar55 = -(uint)(fVar102 <= ABS(fVar221));
  uVar56 = -(uint)(fVar103 <= ABS(fVar104));
  auVar210._0_4_ = (uint)fVar197 & uVar53;
  auVar210._4_4_ = (uint)fVar220 & uVar54;
  auVar210._8_4_ = (uint)fVar221 & uVar55;
  auVar210._12_4_ = (uint)fVar104 & uVar56;
  auVar189._0_4_ = ~uVar53 & (uint)fVar125;
  auVar189._4_4_ = ~uVar54 & (uint)fVar59;
  auVar189._8_4_ = ~uVar55 & (uint)fVar102;
  auVar189._12_4_ = ~uVar56 & (uint)fVar103;
  auVar189 = auVar189 | auVar210;
  auVar69 = rcpps(_DAT_01f80d30,auVar142);
  fVar125 = auVar69._0_4_;
  fVar103 = auVar69._4_4_;
  fVar126 = auVar69._8_4_;
  fVar141 = auVar69._12_4_;
  fVar125 = (1.0 - auVar142._0_4_ * fVar125) * fVar125 + fVar125;
  fVar103 = (1.0 - auVar142._4_4_ * fVar103) * fVar103 + fVar103;
  fVar126 = (1.0 - auVar142._8_4_ * fVar126) * fVar126 + fVar126;
  fVar141 = (1.0 - auVar142._12_4_ * fVar141) * fVar141 + fVar141;
  auVar69 = rcpps(auVar69,auVar156);
  fVar59 = auVar69._0_4_;
  fVar104 = auVar69._4_4_;
  fVar138 = auVar69._8_4_;
  fVar153 = auVar69._12_4_;
  fVar59 = (1.0 - auVar156._0_4_ * fVar59) * fVar59 + fVar59;
  fVar104 = (1.0 - auVar156._4_4_ * fVar104) * fVar104 + fVar104;
  fVar138 = (1.0 - auVar156._8_4_ * fVar138) * fVar138 + fVar138;
  fVar153 = (1.0 - auVar156._12_4_ * fVar153) * fVar153 + fVar153;
  auVar69 = rcpps(auVar69,auVar189);
  fVar102 = auVar69._0_4_;
  fVar124 = auVar69._4_4_;
  fVar139 = auVar69._8_4_;
  fVar154 = auVar69._12_4_;
  fVar102 = (1.0 - auVar189._0_4_ * fVar102) * fVar102 + fVar102;
  fVar124 = (1.0 - auVar189._4_4_ * fVar124) * fVar124 + fVar124;
  fVar139 = (1.0 - auVar189._8_4_ * fVar139) * fVar139 + fVar139;
  fVar154 = (1.0 - auVar189._12_4_ * fVar154) * fVar154 + fVar154;
  uVar48 = *(ulong *)(prim + uVar49 * 7 + 6);
  uVar101 = (undefined2)(uVar48 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar48;
  auVar72._12_2_ = uVar101;
  auVar72._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar48 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar48;
  auVar71._10_2_ = uVar101;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar101;
  auVar70._0_8_ = uVar48;
  uVar101 = (undefined2)(uVar48 >> 0x10);
  auVar34._4_8_ = auVar70._8_8_;
  auVar34._2_2_ = uVar101;
  auVar34._0_2_ = uVar101;
  auVar143._0_8_ =
       CONCAT44(((float)(auVar34._0_4_ >> 0x10) - fVar183) * fVar103,
                ((float)(int)(short)uVar48 - fVar127) * fVar125);
  auVar143._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar184) * fVar126;
  auVar143._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar140) * fVar141;
  uVar48 = *(ulong *)(prim + uVar49 * 9 + 6);
  uVar101 = (undefined2)(uVar48 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar48;
  auVar75._12_2_ = uVar101;
  auVar75._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar48 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar48;
  auVar74._10_2_ = uVar101;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar101;
  auVar73._0_8_ = uVar48;
  uVar101 = (undefined2)(uVar48 >> 0x10);
  auVar35._4_8_ = auVar73._8_8_;
  auVar35._2_2_ = uVar101;
  auVar35._0_2_ = uVar101;
  auVar190._0_4_ = ((float)(int)(short)uVar48 - fVar127) * fVar125;
  auVar190._4_4_ = ((float)(auVar35._0_4_ >> 0x10) - fVar183) * fVar103;
  auVar190._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar184) * fVar126;
  auVar190._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar140) * fVar141;
  lVar43 = uVar42 + uVar49;
  uVar48 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar49 * -2 + 6);
  uVar101 = (undefined2)(uVar42 >> 0x30);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar42;
  auVar213._12_2_ = uVar101;
  auVar213._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar42 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar42;
  auVar212._10_2_ = uVar101;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar101;
  auVar211._0_8_ = uVar42;
  uVar101 = (undefined2)(uVar42 >> 0x10);
  auVar36._4_8_ = auVar211._8_8_;
  auVar36._2_2_ = uVar101;
  auVar36._0_2_ = uVar101;
  auVar214._0_8_ =
       CONCAT44(((float)(auVar36._0_4_ >> 0x10) - fVar195) * fVar104,
                ((float)(int)(short)uVar42 - fVar185) * fVar59);
  auVar214._8_4_ = ((float)(auVar211._8_4_ >> 0x10) - fVar196) * fVar138;
  auVar214._12_4_ = ((float)(auVar212._12_4_ >> 0x10) - fVar232) * fVar153;
  uVar101 = (undefined2)(uVar48 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar48;
  auVar78._12_2_ = uVar101;
  auVar78._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar48 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar48;
  auVar77._10_2_ = uVar101;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar101;
  auVar76._0_8_ = uVar48;
  uVar101 = (undefined2)(uVar48 >> 0x10);
  auVar37._4_8_ = auVar76._8_8_;
  auVar37._2_2_ = uVar101;
  auVar37._0_2_ = uVar101;
  auVar79._0_4_ = ((float)(int)(short)uVar48 - fVar185) * fVar59;
  auVar79._4_4_ = ((float)(auVar37._0_4_ >> 0x10) - fVar195) * fVar104;
  auVar79._8_4_ = ((float)(auVar76._8_4_ >> 0x10) - fVar196) * fVar138;
  auVar79._12_4_ = ((float)(auVar77._12_4_ >> 0x10) - fVar232) * fVar153;
  uVar48 = *(ulong *)(prim + lVar43 + 6);
  uVar101 = (undefined2)(uVar48 >> 0x30);
  auVar171._8_4_ = 0;
  auVar171._0_8_ = uVar48;
  auVar171._12_2_ = uVar101;
  auVar171._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar48 >> 0x20);
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._8_2_ = 0;
  auVar170._0_8_ = uVar48;
  auVar170._10_2_ = uVar101;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._8_2_ = uVar101;
  auVar169._0_8_ = uVar48;
  uVar101 = (undefined2)(uVar48 >> 0x10);
  auVar38._4_8_ = auVar169._8_8_;
  auVar38._2_2_ = uVar101;
  auVar38._0_2_ = uVar101;
  auVar172._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar166) * fVar124,
                ((float)(int)(short)uVar48 - fVar155) * fVar102);
  auVar172._8_4_ = ((float)(auVar169._8_4_ >> 0x10) - fVar167) * fVar139;
  auVar172._12_4_ = ((float)(auVar170._12_4_ >> 0x10) - fVar168) * fVar154;
  uVar48 = *(ulong *)(prim + uVar49 * 0x17 + 6);
  uVar101 = (undefined2)(uVar48 >> 0x30);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar48;
  auVar225._12_2_ = uVar101;
  auVar225._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar48 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar48;
  auVar224._10_2_ = uVar101;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar101;
  auVar223._0_8_ = uVar48;
  uVar101 = (undefined2)(uVar48 >> 0x10);
  auVar39._4_8_ = auVar223._8_8_;
  auVar39._2_2_ = uVar101;
  auVar39._0_2_ = uVar101;
  auVar226._0_4_ = ((float)(int)(short)uVar48 - fVar155) * fVar102;
  auVar226._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar166) * fVar124;
  auVar226._8_4_ = ((float)(auVar223._8_4_ >> 0x10) - fVar167) * fVar139;
  auVar226._12_4_ = ((float)(auVar224._12_4_ >> 0x10) - fVar168) * fVar154;
  auVar233._8_4_ = auVar143._8_4_;
  auVar233._0_8_ = auVar143._0_8_;
  auVar233._12_4_ = auVar143._12_4_;
  auVar234 = minps(auVar233,auVar190);
  auVar105._8_4_ = auVar214._8_4_;
  auVar105._0_8_ = auVar214._0_8_;
  auVar105._12_4_ = auVar214._12_4_;
  auVar69 = minps(auVar105,auVar79);
  auVar234 = maxps(auVar234,auVar69);
  auVar106._8_4_ = auVar172._8_4_;
  auVar106._0_8_ = auVar172._0_8_;
  auVar106._12_4_ = auVar172._12_4_;
  auVar69 = minps(auVar106,auVar226);
  uVar47 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar157._4_4_ = uVar47;
  auVar157._0_4_ = uVar47;
  auVar157._8_4_ = uVar47;
  auVar157._12_4_ = uVar47;
  auVar69 = maxps(auVar69,auVar157);
  auVar69 = maxps(auVar234,auVar69);
  local_258 = auVar69._0_4_ * 0.99999964;
  fStack_254 = auVar69._4_4_ * 0.99999964;
  fStack_250 = auVar69._8_4_ * 0.99999964;
  fStack_24c = auVar69._12_4_ * 0.99999964;
  auVar69 = maxps(auVar143,auVar190);
  auVar234 = maxps(auVar214,auVar79);
  auVar69 = minps(auVar69,auVar234);
  auVar234 = maxps(auVar172,auVar226);
  fVar125 = ray->tfar;
  auVar80._4_4_ = fVar125;
  auVar80._0_4_ = fVar125;
  auVar80._8_4_ = fVar125;
  auVar80._12_4_ = fVar125;
  auVar234 = minps(auVar234,auVar80);
  auVar69 = minps(auVar69,auVar234);
  auVar107._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && local_258 <= auVar69._0_4_ * 1.0000004);
  auVar107._4_4_ = -(uint)(1 < (byte)PVar6 && fStack_254 <= auVar69._4_4_ * 1.0000004);
  auVar107._8_4_ = -(uint)(2 < (byte)PVar6 && fStack_250 <= auVar69._8_4_ * 1.0000004);
  auVar107._12_4_ = -(uint)(3 < (byte)PVar6 && fStack_24c <= auVar69._12_4_ * 1.0000004);
  uVar53 = movmskps((int)lVar43,auVar107);
  if (uVar53 == 0) {
    return false;
  }
  uVar53 = uVar53 & 0xff;
  local_1d8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1d8._12_4_ = 0;
  local_368 = prim;
LAB_00a9905e:
  uVar48 = (ulong)uVar53;
  lVar43 = 0;
  if (uVar48 != 0) {
    for (; (uVar53 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
    }
  }
  uVar48 = uVar48 - 1 & uVar48;
  uVar53 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar53].ptr;
  uVar42 = *(ulong *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  local_360 = (ulong)*(uint *)(prim + lVar43 * 4 + 6);
  uVar49 = (ulong)*(uint *)(uVar42 + _Var8 * *(uint *)(prim + lVar43 * 4 + 6));
  p_Var44 = pGVar7[1].intersectionFilterN;
  lVar43 = 0;
  if (uVar48 != 0) {
    for (; (uVar48 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
    }
  }
  lVar43 = *(long *)&pGVar7[1].time_range.upper;
  pfVar1 = (float *)(lVar43 + (long)p_Var44 * uVar49);
  pfVar2 = (float *)(lVar43 + (uVar49 + 1) * (long)p_Var44);
  pfVar3 = (float *)(lVar43 + (uVar49 + 2) * (long)p_Var44);
  pfVar4 = (float *)(lVar43 + (uVar49 + 3) * (long)p_Var44);
  if ((uVar48 != 0) && (uVar49 = uVar48 - 1 & uVar48, uVar49 != 0)) {
    lVar43 = 0;
    if (uVar49 != 0) {
      for (; (uVar49 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
      }
    }
    uVar42 = (ulong)*(uint *)(uVar42 + _Var8 * *(uint *)(prim + lVar43 * 4 + 6));
  }
  fVar125 = (ray->org).field_0.m128[0];
  fVar59 = (ray->org).field_0.m128[1];
  fVar102 = (ray->org).field_0.m128[2];
  local_298 = (ray->dir).field_0.m128[0];
  fVar103 = (ray->dir).field_0.m128[1];
  local_448 = (ray->dir).field_0.m128[2];
  fVar104 = (ray->dir).field_0.m128[3];
  fStack_13c = local_298 * local_298;
  fVar124 = fVar103 * fVar103;
  fVar126 = local_448 * local_448;
  fVar104 = fVar104 * fVar104;
  fVar138 = fStack_13c + fVar124 + fVar126;
  auVar158._0_8_ = CONCAT44(fVar124 + fVar124 + fVar104,fVar138);
  auVar158._8_4_ = fVar126 + fVar124 + fVar126;
  auVar158._12_4_ = fVar104 + fVar124 + fVar104;
  auVar144._8_4_ = auVar158._8_4_;
  auVar144._0_8_ = auVar158._0_8_;
  auVar144._12_4_ = auVar158._12_4_;
  auVar69 = rcpss(auVar144,auVar158);
  local_4b8 = (2.0 - fVar138 * auVar69._0_4_) * auVar69._0_4_ *
              (((pfVar1[2] + pfVar2[2] + pfVar3[2] + pfVar4[2]) * 0.25 - fVar102) * local_448 +
              ((pfVar1[1] + pfVar2[1] + pfVar3[1] + pfVar4[1]) * 0.25 - fVar59) * fVar103 +
              ((*pfVar1 + *pfVar2 + *pfVar3 + *pfVar4) * 0.25 - fVar125) * local_298);
  local_2d8 = ZEXT416((uint)local_4b8);
  fVar125 = local_298 * local_4b8 + fVar125;
  fVar59 = fVar103 * local_4b8 + fVar59;
  fVar102 = local_448 * local_4b8 + fVar102;
  local_498 = *pfVar1 - fVar125;
  fStack_494 = pfVar1[1] - fVar59;
  fStack_490 = pfVar1[2] - fVar102;
  fVar155 = pfVar1[3] - 0.0;
  fVar127 = *pfVar3 - fVar125;
  local_168 = pfVar3[1] - fVar59;
  local_178 = pfVar3[2] - fVar102;
  fStack_31c = pfVar3[3] - 0.0;
  local_158 = *pfVar2 - fVar125;
  fStack_314 = pfVar2[1] - fVar59;
  fVar139 = pfVar2[2] - fVar102;
  fVar104 = pfVar2[3] - 0.0;
  fVar125 = *pfVar4 - fVar125;
  fVar59 = pfVar4[1] - fVar59;
  fVar102 = pfVar4[2] - fVar102;
  fVar183 = pfVar4[3] - 0.0;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  local_318 = local_158;
  fStack_310 = fVar139;
  fStack_30c = fVar104;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  local_148 = fStack_13c + fVar126 + fVar124;
  fStack_144 = fStack_13c + fVar126 + fVar124;
  fStack_140 = fStack_13c + fVar126 + fVar124;
  fStack_13c = fStack_13c + fVar126 + fVar124;
  local_328 = fVar127;
  fStack_324 = local_168;
  fStack_320 = local_178;
  local_288 = fStack_31c;
  fStack_284 = fStack_31c;
  fStack_280 = fStack_31c;
  fStack_27c = fStack_31c;
  local_188 = fVar125;
  fStack_184 = fVar125;
  fStack_180 = fVar125;
  fStack_17c = fVar125;
  local_198 = fVar59;
  fStack_194 = fVar59;
  fStack_190 = fVar59;
  fStack_18c = fVar59;
  local_1a8 = fVar102;
  fStack_1a4 = fVar102;
  fStack_1a0 = fVar102;
  fStack_19c = fVar102;
  local_1b8 = fVar183;
  fStack_1b4 = fVar183;
  fStack_1b0 = fVar183;
  fStack_1ac = fVar183;
  fStack_294 = local_298;
  fStack_290 = local_298;
  fStack_28c = local_298;
  local_2a8 = ABS(local_148);
  fStack_2a4 = ABS(fStack_144);
  fStack_2a0 = ABS(fStack_140);
  fStack_29c = ABS(fStack_13c);
  local_5bc = 1;
  uVar49 = 0;
  bVar50 = false;
  local_1c8 = 0.0;
  fStack_1c4 = 1.0;
  fStack_444 = local_448;
  fStack_440 = local_448;
  fStack_43c = local_448;
  local_1f8 = local_498;
  fStack_1f4 = local_498;
  fStack_1f0 = local_498;
  fStack_1ec = local_498;
  local_208 = fStack_494;
  fStack_204 = fStack_494;
  fStack_200 = fStack_494;
  fStack_1fc = fStack_494;
  local_218 = fStack_490;
  fStack_214 = fStack_490;
  fStack_210 = fStack_490;
  fStack_20c = fStack_490;
  local_338 = fVar155;
  fStack_334 = fVar155;
  fStack_330 = fVar155;
  fStack_32c = fVar155;
  local_228 = fStack_314;
  fStack_224 = fStack_314;
  fStack_220 = fStack_314;
  fStack_21c = fStack_314;
  local_348 = fVar139;
  fStack_344 = fVar139;
  fStack_340 = fVar139;
  fStack_33c = fVar139;
  local_358 = fVar104;
  fStack_354 = fVar104;
  fStack_350 = fVar104;
  fStack_34c = fVar104;
  fVar124 = fVar104;
  fVar126 = fVar104;
  fVar138 = fVar104;
  fVar141 = fVar139;
  fVar153 = fVar139;
  fVar154 = fVar139;
  fVar166 = fVar155;
  fVar167 = fVar155;
  fVar168 = fVar155;
  fStack_4b4 = local_4b8;
  fStack_4b0 = local_4b8;
  fStack_4ac = local_4b8;
  fStack_48c = fVar155;
  do {
    iVar51 = (int)uVar49;
    local_408 = fStack_1c4 - local_1c8;
    uStack_1c0 = 0;
    uStack_1bc = 0;
    fStack_404 = local_408;
    fStack_400 = local_408;
    fStack_3fc = local_408;
    local_418._4_4_ = local_1c8;
    local_418._0_4_ = local_1c8;
    fStack_410 = local_1c8;
    fStack_40c = local_1c8;
    fVar184 = local_408 * 0.0 + local_1c8;
    fVar140 = local_408 * 0.33333334 + local_1c8;
    fVar185 = local_408 * 0.6666667 + local_1c8;
    fVar195 = local_408 * 1.0 + local_1c8;
    fVar196 = 1.0 - fVar184;
    fVar197 = 1.0 - fVar140;
    fVar220 = 1.0 - fVar185;
    fVar221 = 1.0 - fVar195;
    fVar262 = local_158 * fVar196 + fVar127 * fVar184;
    fVar264 = fStack_154 * fVar197 + fVar127 * fVar140;
    fVar266 = fStack_150 * fVar220 + fVar127 * fVar185;
    fVar268 = fStack_14c * fVar221 + fVar127 * fVar195;
    fVar274 = local_228 * fVar196 + local_168 * fVar184;
    fVar276 = fStack_224 * fVar197 + fStack_164 * fVar140;
    fVar247 = fStack_220 * fVar220 + fStack_160 * fVar185;
    fVar248 = fStack_21c * fVar221 + fStack_15c * fVar195;
    fVar250 = fVar139 * fVar196 + local_178 * fVar184;
    fVar255 = fVar141 * fVar197 + fStack_174 * fVar140;
    fVar257 = fVar153 * fVar220 + fStack_170 * fVar185;
    fVar259 = fVar154 * fVar221 + fStack_16c * fVar195;
    fVar254 = fVar104 * fVar196 + local_288 * fVar184;
    fVar256 = fVar124 * fVar197 + fStack_284 * fVar140;
    fVar258 = fVar126 * fVar220 + fStack_280 * fVar185;
    fVar260 = fVar138 * fVar221 + fStack_27c * fVar195;
    fVar222 = (local_1f8 * fVar196 + local_158 * fVar184) * fVar196 + fVar184 * fVar262;
    fVar230 = (fStack_1f4 * fVar197 + fStack_154 * fVar140) * fVar197 + fVar140 * fVar264;
    fVar231 = (fStack_1f0 * fVar220 + fStack_150 * fVar185) * fVar220 + fVar185 * fVar266;
    fVar232 = (fStack_1ec * fVar221 + fStack_14c * fVar195) * fVar221 + fVar195 * fVar268;
    fVar241 = (local_208 * fVar196 + local_228 * fVar184) * fVar196 + fVar184 * fVar274;
    fVar242 = (fStack_204 * fVar197 + fStack_224 * fVar140) * fVar197 + fVar140 * fVar276;
    fVar243 = (fStack_200 * fVar220 + fStack_220 * fVar185) * fVar220 + fVar185 * fVar247;
    fVar245 = (fStack_1fc * fVar221 + fStack_21c * fVar195) * fVar221 + fVar195 * fVar248;
    fVar139 = (local_218 * fVar196 + fVar139 * fVar184) * fVar196 + fVar184 * fVar250;
    fVar141 = (fStack_214 * fVar197 + fVar141 * fVar140) * fVar197 + fVar140 * fVar255;
    fVar153 = (fStack_210 * fVar220 + fVar153 * fVar185) * fVar220 + fVar185 * fVar257;
    fVar154 = (fStack_20c * fVar221 + fVar154 * fVar195) * fVar221 + fVar195 * fVar259;
    fVar246 = (fVar155 * fVar196 + fVar104 * fVar184) * fVar196 + fVar184 * fVar254;
    fVar124 = (fVar166 * fVar197 + fVar124 * fVar140) * fVar197 + fVar140 * fVar256;
    fVar249 = (fVar167 * fVar220 + fVar126 * fVar185) * fVar220 + fVar185 * fVar258;
    fVar138 = (fVar168 * fVar221 + fVar138 * fVar195) * fVar221 + fVar195 * fVar260;
    fVar262 = fVar262 * fVar196 + (fVar127 * fVar196 + local_188 * fVar184) * fVar184;
    fVar264 = fVar264 * fVar197 + (fVar127 * fVar197 + fStack_184 * fVar140) * fVar140;
    fVar266 = fVar266 * fVar220 + (fVar127 * fVar220 + fStack_180 * fVar185) * fVar185;
    fVar268 = fVar268 * fVar221 + (fVar127 * fVar221 + fStack_17c * fVar195) * fVar195;
    fVar274 = fVar274 * fVar196 + (local_168 * fVar196 + local_198 * fVar184) * fVar184;
    fVar276 = fVar276 * fVar197 + (fStack_164 * fVar197 + fStack_194 * fVar140) * fVar140;
    fVar247 = fVar247 * fVar220 + (fStack_160 * fVar220 + fStack_190 * fVar185) * fVar185;
    fVar248 = fVar248 * fVar221 + (fStack_15c * fVar221 + fStack_18c * fVar195) * fVar195;
    fVar250 = fVar250 * fVar196 + (local_178 * fVar196 + local_1a8 * fVar184) * fVar184;
    fVar255 = fVar255 * fVar197 + (fStack_174 * fVar197 + fStack_1a4 * fVar140) * fVar140;
    fVar257 = fVar257 * fVar220 + (fStack_170 * fVar220 + fStack_1a0 * fVar185) * fVar185;
    fVar259 = fVar259 * fVar221 + (fStack_16c * fVar221 + fStack_19c * fVar195) * fVar195;
    fVar254 = fVar254 * fVar196 + (local_288 * fVar196 + local_1b8 * fVar184) * fVar184;
    fVar126 = fVar256 * fVar197 + (fStack_284 * fVar197 + fStack_1b4 * fVar140) * fVar140;
    fVar256 = fVar258 * fVar220 + (fStack_280 * fVar220 + fStack_1b0 * fVar185) * fVar185;
    fVar258 = fVar260 * fVar221 + (fStack_27c * fVar221 + fStack_1ac * fVar195) * fVar195;
    fVar269 = fVar196 * fVar222 + fVar184 * fVar262;
    fVar275 = fVar197 * fVar230 + fVar140 * fVar264;
    fVar277 = fVar220 * fVar231 + fVar185 * fVar266;
    fVar278 = fVar221 * fVar232 + fVar195 * fVar268;
    fVar279 = fVar196 * fVar241 + fVar184 * fVar274;
    fVar280 = fVar197 * fVar242 + fVar140 * fVar276;
    fVar281 = fVar220 * fVar243 + fVar185 * fVar247;
    fVar282 = fVar221 * fVar245 + fVar195 * fVar248;
    fVar261 = fVar196 * fVar139 + fVar184 * fVar250;
    fVar263 = fVar197 * fVar141 + fVar140 * fVar255;
    fVar265 = fVar220 * fVar153 + fVar185 * fVar257;
    fVar267 = fVar221 * fVar154 + fVar195 * fVar259;
    fVar104 = local_408 * 0.11111111;
    fVar155 = fVar196 * fVar246 + fVar184 * fVar254;
    fVar166 = fVar197 * fVar124 + fVar140 * fVar126;
    uVar45 = CONCAT44(fVar166,fVar155);
    fVar167 = fVar220 * fVar249 + fVar185 * fVar256;
    fVar168 = fVar221 * fVar138 + fVar195 * fVar258;
    fVar262 = (fVar262 - fVar222) * 3.0 * fVar104;
    local_3c8 = (fVar264 - fVar230) * 3.0 * fVar104;
    fStack_3c4 = (fVar266 - fVar231) * 3.0 * fVar104;
    fStack_3c0 = (fVar268 - fVar232) * 3.0 * fVar104;
    local_388 = (fVar274 - fVar241) * 3.0 * fVar104;
    fStack_384 = (fVar276 - fVar242) * 3.0 * fVar104;
    fStack_380 = (fVar247 - fVar243) * 3.0 * fVar104;
    fStack_37c = (fVar248 - fVar245) * 3.0 * fVar104;
    local_3d8._0_4_ = (fVar250 - fVar139) * 3.0 * fVar104;
    local_3d8._4_4_ = (fVar255 - fVar141) * 3.0 * fVar104;
    fStack_3d0 = (fVar257 - fVar153) * 3.0 * fVar104;
    fStack_3cc = (fVar259 - fVar154) * 3.0 * fVar104;
    fVar126 = fVar104 * (fVar126 - fVar124) * 3.0;
    fVar139 = fVar104 * (fVar256 - fVar249) * 3.0;
    fVar153 = fVar104 * (fVar258 - fVar138) * 3.0;
    local_398._4_4_ = fVar277;
    local_398._0_4_ = fVar275;
    fStack_390 = fVar278;
    fStack_38c = 0.0;
    local_3a8._4_4_ = fVar281;
    local_3a8._0_4_ = fVar280;
    fStack_3a0 = fVar282;
    fStack_39c = 0.0;
    auVar108._4_4_ = fVar167;
    auVar108._0_4_ = fVar166;
    auVar108._8_4_ = fVar168;
    auVar108._12_4_ = 0;
    auVar109._0_8_ = CONCAT44(fVar167 - fVar139,fVar166 - fVar126);
    auVar109._8_4_ = fVar168 - fVar153;
    auVar109._12_4_ = 0;
    fVar184 = fVar280 - fVar279;
    fVar140 = fVar281 - fVar280;
    fVar185 = fVar282 - fVar281;
    fVar195 = 0.0 - fVar282;
    local_3b8._4_4_ = fVar265;
    local_3b8._0_4_ = fVar263;
    fStack_3b0 = fVar267;
    fStack_3ac = 0.0;
    local_2e8._0_4_ = fVar263 - fVar261;
    local_2e8._4_4_ = fVar265 - fVar263;
    fStack_2e0 = fVar267 - fVar265;
    fStack_2dc = 0.0 - fVar267;
    fVar196 = local_388 * (float)local_2e8._0_4_ - (float)local_3d8._0_4_ * fVar184;
    fVar197 = fStack_384 * (float)local_2e8._4_4_ - (float)local_3d8._4_4_ * fVar140;
    fVar220 = fStack_380 * fStack_2e0 - fStack_3d0 * fVar185;
    fVar221 = fStack_37c * fStack_2dc - fStack_3cc * fVar195;
    local_2f8._0_4_ = fVar275 - fVar269;
    local_2f8._4_4_ = fVar277 - fVar275;
    fStack_2f0 = fVar278 - fVar277;
    fStack_2ec = 0.0 - fVar278;
    fVar222 = (float)local_3d8._0_4_ * (float)local_2f8._0_4_ - fVar262 * (float)local_2e8._0_4_;
    fVar230 = (float)local_3d8._4_4_ * (float)local_2f8._4_4_ - local_3c8 * (float)local_2e8._4_4_;
    fVar231 = fStack_3d0 * fStack_2f0 - fStack_3c4 * fStack_2e0;
    fVar232 = fStack_3cc * fStack_2ec - fStack_3c0 * fStack_2dc;
    fVar241 = fVar262 * fVar184 - local_388 * (float)local_2f8._0_4_;
    fVar242 = local_3c8 * fVar140 - fStack_384 * (float)local_2f8._4_4_;
    fVar243 = fStack_3c4 * fVar185 - fStack_380 * fStack_2f0;
    fVar245 = fStack_3c0 * fVar195 - fStack_37c * fStack_2ec;
    auVar215._0_4_ = fVar184 * fVar184 + (float)local_2e8._0_4_ * (float)local_2e8._0_4_;
    auVar215._4_4_ = fVar140 * fVar140 + (float)local_2e8._4_4_ * (float)local_2e8._4_4_;
    auVar215._8_4_ = fVar185 * fVar185 + fStack_2e0 * fStack_2e0;
    auVar215._12_4_ = fVar195 * fVar195 + fStack_2dc * fStack_2dc;
    auVar191._0_4_ = (float)local_2f8._0_4_ * (float)local_2f8._0_4_ + auVar215._0_4_;
    auVar191._4_4_ = (float)local_2f8._4_4_ * (float)local_2f8._4_4_ + auVar215._4_4_;
    auVar191._8_4_ = fStack_2f0 * fStack_2f0 + auVar215._8_4_;
    auVar191._12_4_ = fStack_2ec * fStack_2ec + auVar215._12_4_;
    auVar69 = rcpps(auVar215,auVar191);
    fVar124 = auVar69._0_4_;
    fVar138 = auVar69._4_4_;
    fVar141 = auVar69._8_4_;
    fVar154 = auVar69._12_4_;
    fVar124 = (1.0 - fVar124 * auVar191._0_4_) * fVar124 + fVar124;
    fVar138 = (1.0 - fVar138 * auVar191._4_4_) * fVar138 + fVar138;
    fVar141 = (1.0 - fVar141 * auVar191._8_4_) * fVar141 + fVar141;
    fVar154 = (1.0 - fVar154 * auVar191._12_4_) * fVar154 + fVar154;
    fVar249 = (float)local_2e8._0_4_ * fStack_384 - fVar184 * (float)local_3d8._4_4_;
    fVar256 = (float)local_2e8._4_4_ * fStack_380 - fVar140 * fStack_3d0;
    fVar258 = fStack_2e0 * fStack_37c - fVar185 * fStack_3cc;
    fVar260 = fStack_2dc * 0.0 - fVar195 * 0.0;
    auVar235._8_4_ = fVar167;
    auVar235._0_8_ = uVar45;
    auVar235._12_4_ = fVar168;
    local_3f8 = (float)local_3d8._4_4_;
    fStack_3f4 = fStack_3d0;
    fStack_3f0 = fStack_3cc;
    fStack_3ec = 0.0;
    fVar264 = (float)local_2f8._0_4_ * (float)local_3d8._4_4_ - (float)local_2e8._0_4_ * local_3c8;
    fVar266 = (float)local_2f8._4_4_ * fStack_3d0 - (float)local_2e8._4_4_ * fStack_3c4;
    fVar268 = fStack_2f0 * fStack_3cc - fStack_2e0 * fStack_3c0;
    fVar274 = fStack_2ec * 0.0 - fStack_2dc * 0.0;
    local_3e8 = fStack_384;
    fStack_3e4 = fStack_380;
    fStack_3e0 = fStack_37c;
    fStack_3dc = 0.0;
    fStack_3bc = 0.0;
    fVar276 = fVar184 * local_3c8 - (float)local_2f8._0_4_ * fStack_384;
    fVar247 = fVar140 * fStack_3c4 - (float)local_2f8._4_4_ * fStack_380;
    fVar248 = fVar185 * fStack_3c0 - fStack_2f0 * fStack_37c;
    fVar250 = fVar195 * 0.0 - fStack_2ec * 0.0;
    auVar173._0_4_ = (fVar196 * fVar196 + fVar222 * fVar222 + fVar241 * fVar241) * fVar124;
    auVar173._4_4_ = (fVar197 * fVar197 + fVar230 * fVar230 + fVar242 * fVar242) * fVar138;
    auVar173._8_4_ = (fVar220 * fVar220 + fVar231 * fVar231 + fVar243 * fVar243) * fVar141;
    auVar173._12_4_ = (fVar221 * fVar221 + fVar232 * fVar232 + fVar245 * fVar245) * fVar154;
    auVar227._0_4_ = (fVar249 * fVar249 + fVar264 * fVar264 + fVar276 * fVar276) * fVar124;
    auVar227._4_4_ = (fVar256 * fVar256 + fVar266 * fVar266 + fVar247 * fVar247) * fVar138;
    auVar227._8_4_ = (fVar258 * fVar258 + fVar268 * fVar268 + fVar248 * fVar248) * fVar141;
    auVar227._12_4_ = (fVar260 * fVar260 + fVar274 * fVar274 + fVar250 * fVar250) * fVar154;
    auVar174 = maxps(auVar173,auVar227);
    auVar81._8_4_ = fVar167;
    auVar81._0_8_ = uVar45;
    auVar81._12_4_ = fVar168;
    auVar13._4_4_ = fVar166 + fVar126;
    auVar13._0_4_ = fVar155 + fVar104 * (fVar254 - fVar246) * 3.0;
    auVar13._8_4_ = fVar167 + fVar139;
    auVar13._12_4_ = fVar168 + fVar153;
    auVar69 = maxps(auVar81,auVar13);
    auVar216._8_4_ = auVar109._8_4_;
    auVar216._0_8_ = auVar109._0_8_;
    auVar216._12_4_ = 0;
    auVar234 = maxps(auVar216,auVar108);
    auVar69 = maxps(auVar69,auVar234);
    auVar236 = minps(auVar235,auVar13);
    auVar234 = minps(auVar109,auVar108);
    auVar236 = minps(auVar236,auVar234);
    auVar234 = sqrtps(auVar234,auVar174);
    auVar174 = rsqrtps(auVar227,auVar191);
    fVar104 = auVar174._0_4_;
    fVar124 = auVar174._4_4_;
    fVar126 = auVar174._8_4_;
    fVar138 = auVar174._12_4_;
    local_308 = fVar104 * fVar104 * auVar191._0_4_ * -0.5 * fVar104 + fVar104 * 1.5;
    fStack_304 = fVar124 * fVar124 * auVar191._4_4_ * -0.5 * fVar124 + fVar124 * 1.5;
    fStack_300 = fVar126 * fVar126 * auVar191._8_4_ * -0.5 * fVar126 + fVar126 * 1.5;
    fStack_2fc = fVar138 * fVar138 * auVar191._12_4_ * -0.5 * fVar138 + fVar138 * 1.5;
    fVar139 = 0.0 - fVar279;
    fVar141 = 0.0 - fVar280;
    fVar153 = 0.0 - fVar281;
    fVar154 = 0.0 - fVar282;
    fVar196 = 0.0 - fVar261;
    fVar197 = 0.0 - fVar263;
    fVar220 = 0.0 - fVar265;
    fVar221 = 0.0 - fVar267;
    auVar272._4_4_ = fStack_444;
    auVar272._0_4_ = local_448;
    auVar272._8_4_ = fStack_440;
    auVar272._12_4_ = fStack_43c;
    fVar222 = 0.0 - fVar269;
    fVar230 = 0.0 - fVar275;
    fVar231 = 0.0 - fVar277;
    fVar232 = 0.0 - fVar278;
    local_238 = local_298 * (float)local_2f8._0_4_ * local_308 +
                fVar103 * fVar184 * local_308 + local_448 * (float)local_2e8._0_4_ * local_308;
    fStack_234 = fStack_294 * (float)local_2f8._4_4_ * fStack_304 +
                 fVar103 * fVar140 * fStack_304 + fStack_444 * (float)local_2e8._4_4_ * fStack_304;
    fStack_230 = fStack_290 * fStack_2f0 * fStack_300 +
                 fVar103 * fVar185 * fStack_300 + fStack_440 * fStack_2e0 * fStack_300;
    fStack_22c = fStack_28c * fStack_2ec * fStack_2fc +
                 fVar103 * fVar195 * fStack_2fc + fStack_43c * fStack_2dc * fStack_2fc;
    fVar246 = (float)local_2f8._0_4_ * local_308 * fVar222 +
              fVar184 * local_308 * fVar139 + (float)local_2e8._0_4_ * local_308 * fVar196;
    fVar249 = (float)local_2f8._4_4_ * fStack_304 * fVar230 +
              fVar140 * fStack_304 * fVar141 + (float)local_2e8._4_4_ * fStack_304 * fVar197;
    fVar254 = fStack_2f0 * fStack_300 * fVar231 +
              fVar185 * fStack_300 * fVar153 + fStack_2e0 * fStack_300 * fVar220;
    fVar256 = fStack_2ec * fStack_2fc * fVar232 +
              fVar195 * fStack_2fc * fVar154 + fStack_2dc * fStack_2fc * fVar221;
    fVar155 = (local_298 * fVar222 + fVar103 * fVar139 + local_448 * fVar196) - local_238 * fVar246;
    fVar166 = (fStack_294 * fVar230 + fVar103 * fVar141 + fStack_444 * fVar197) -
              fStack_234 * fVar249;
    fVar167 = (fStack_290 * fVar231 + fVar103 * fVar153 + fStack_440 * fVar220) -
              fStack_230 * fVar254;
    fVar168 = (fStack_28c * fVar232 + fVar103 * fVar154 + fStack_43c * fVar221) -
              fStack_22c * fVar256;
    fVar241 = (fVar222 * fVar222 + fVar139 * fVar139 + fVar196 * fVar196) - fVar246 * fVar246;
    fVar242 = (fVar230 * fVar230 + fVar141 * fVar141 + fVar197 * fVar197) - fVar249 * fVar249;
    fVar243 = (fVar231 * fVar231 + fVar153 * fVar153 + fVar220 * fVar220) - fVar254 * fVar254;
    fVar245 = (fVar232 * fVar232 + fVar154 * fVar154 + fVar221 * fVar221) - fVar256 * fVar256;
    fVar104 = (auVar69._0_4_ + auVar234._0_4_) * 1.0000002;
    fVar124 = (auVar69._4_4_ + auVar234._4_4_) * 1.0000002;
    fVar126 = (auVar69._8_4_ + auVar234._8_4_) * 1.0000002;
    fVar138 = (auVar69._12_4_ + auVar234._12_4_) * 1.0000002;
    fVar104 = fVar241 - fVar104 * fVar104;
    fVar124 = fVar242 - fVar124 * fVar124;
    fVar126 = fVar243 - fVar126 * fVar126;
    fVar138 = fVar245 - fVar138 * fVar138;
    local_248 = local_238 * local_238;
    fStack_244 = fStack_234 * fStack_234;
    fStack_240 = fStack_230 * fStack_230;
    fStack_23c = fStack_22c * fStack_22c;
    local_2b8 = local_148 - local_248;
    fStack_2b4 = fStack_144 - fStack_244;
    fStack_2b0 = fStack_140 - fStack_240;
    fStack_2ac = fStack_13c - fStack_23c;
    auVar192._0_4_ = fVar155 + fVar155;
    auVar192._4_4_ = fVar166 + fVar166;
    auVar192._8_4_ = fVar167 + fVar167;
    auVar192._12_4_ = fVar168 + fVar168;
    local_438 = auVar192._0_4_ * auVar192._0_4_;
    fStack_434 = auVar192._4_4_ * auVar192._4_4_;
    fStack_430 = auVar192._8_4_ * auVar192._8_4_;
    fStack_42c = auVar192._12_4_ * auVar192._12_4_;
    auVar82._0_4_ = local_438 - local_2b8 * 4.0 * fVar104;
    auVar82._4_4_ = fStack_434 - fStack_2b4 * 4.0 * fVar124;
    auVar82._8_4_ = fStack_430 - fStack_2b0 * 4.0 * fVar126;
    auVar82._12_4_ = fStack_42c - fStack_2ac * 4.0 * fVar138;
    local_428 = (auVar236._0_4_ - auVar234._0_4_) * 0.99999976;
    fStack_424 = (auVar236._4_4_ - auVar234._4_4_) * 0.99999976;
    fStack_420 = (auVar236._8_4_ - auVar234._8_4_) * 0.99999976;
    fStack_41c = (auVar236._12_4_ - auVar234._12_4_) * 0.99999976;
    auVar175._4_4_ = -(uint)(0.0 <= auVar82._4_4_);
    auVar175._0_4_ = -(uint)(0.0 <= auVar82._0_4_);
    auVar175._8_4_ = -(uint)(0.0 <= auVar82._8_4_);
    auVar175._12_4_ = -(uint)(0.0 <= auVar82._12_4_);
    uVar47 = (undefined4)(uVar42 >> 0x20);
    iVar40 = movmskps((int)uVar42,auVar175);
    if (iVar40 == 0) {
      iVar40 = 0;
      auVar228 = _DAT_01f7aa00;
      auVar284 = _DAT_01f7a9f0;
    }
    else {
      auVar234 = sqrtps(auVar272,auVar82);
      bVar52 = 0.0 <= auVar82._0_4_;
      uVar54 = -(uint)bVar52;
      bVar9 = 0.0 <= auVar82._4_4_;
      uVar55 = -(uint)bVar9;
      bVar10 = 0.0 <= auVar82._8_4_;
      uVar56 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar82._12_4_;
      uVar57 = -(uint)bVar11;
      auVar110._0_4_ = local_2b8 + local_2b8;
      auVar110._4_4_ = fStack_2b4 + fStack_2b4;
      auVar110._8_4_ = fStack_2b0 + fStack_2b0;
      auVar110._12_4_ = fStack_2ac + fStack_2ac;
      auVar69 = rcpps(auVar192,auVar110);
      fVar258 = auVar69._0_4_;
      fVar260 = auVar69._4_4_;
      fVar264 = auVar69._8_4_;
      fVar266 = auVar69._12_4_;
      fVar258 = (1.0 - auVar110._0_4_ * fVar258) * fVar258 + fVar258;
      fVar260 = (1.0 - auVar110._4_4_ * fVar260) * fVar260 + fVar260;
      fVar264 = (1.0 - auVar110._8_4_ * fVar264) * fVar264 + fVar264;
      fVar266 = (1.0 - auVar110._12_4_ * fVar266) * fVar266 + fVar266;
      fVar155 = (-auVar192._0_4_ - auVar234._0_4_) * fVar258;
      fVar166 = (-auVar192._4_4_ - auVar234._4_4_) * fVar260;
      fVar167 = (-auVar192._8_4_ - auVar234._8_4_) * fVar264;
      fVar168 = (-auVar192._12_4_ - auVar234._12_4_) * fVar266;
      fVar258 = (auVar234._0_4_ - auVar192._0_4_) * fVar258;
      fVar260 = (auVar234._4_4_ - auVar192._4_4_) * fVar260;
      fVar264 = (auVar234._8_4_ - auVar192._8_4_) * fVar264;
      fVar266 = (auVar234._12_4_ - auVar192._12_4_) * fVar266;
      local_1e8 = (local_238 * fVar155 + fVar246) * local_308;
      fStack_1e4 = (fStack_234 * fVar166 + fVar249) * fStack_304;
      fStack_1e0 = (fStack_230 * fVar167 + fVar254) * fStack_300;
      fStack_1dc = (fStack_22c * fVar168 + fVar256) * fStack_2fc;
      local_458._4_4_ = (fStack_234 * fVar260 + fVar249) * fStack_304;
      local_458._0_4_ = (local_238 * fVar258 + fVar246) * local_308;
      fStack_450 = (fStack_230 * fVar264 + fVar254) * fStack_300;
      fStack_44c = (fStack_22c * fVar266 + fVar256) * fStack_2fc;
      auVar111._0_4_ = (uint)fVar155 & uVar54;
      auVar111._4_4_ = (uint)fVar166 & uVar55;
      auVar111._8_4_ = (uint)fVar167 & uVar56;
      auVar111._12_4_ = (uint)fVar168 & uVar57;
      auVar284._0_8_ = CONCAT44(~uVar55,~uVar54) & 0x7f8000007f800000;
      auVar284._8_4_ = ~uVar56 & 0x7f800000;
      auVar284._12_4_ = ~uVar57 & 0x7f800000;
      auVar284 = auVar284 | auVar111;
      auVar270._0_4_ = (uint)fVar258 & uVar54;
      auVar270._4_4_ = (uint)fVar260 & uVar55;
      auVar270._8_4_ = (uint)fVar264 & uVar56;
      auVar270._12_4_ = (uint)fVar266 & uVar57;
      auVar228._0_8_ = CONCAT44(~uVar55,~uVar54) & 0xff800000ff800000;
      auVar228._8_4_ = ~uVar56 & 0xff800000;
      auVar228._12_4_ = ~uVar57 & 0xff800000;
      auVar228 = auVar228 | auVar270;
      auVar193._0_8_ = CONCAT44(fStack_244,local_248) & 0x7fffffff7fffffff;
      auVar193._8_4_ = ABS(fStack_240);
      auVar193._12_4_ = ABS(fStack_23c);
      auVar21._4_4_ = fStack_2a4;
      auVar21._0_4_ = local_2a8;
      auVar21._8_4_ = fStack_2a0;
      auVar21._12_4_ = fStack_29c;
      auVar69 = maxps(auVar21,auVar193);
      fVar155 = auVar69._0_4_ * 1.9073486e-06;
      fVar166 = auVar69._4_4_ * 1.9073486e-06;
      fVar167 = auVar69._8_4_ * 1.9073486e-06;
      fVar168 = auVar69._12_4_ * 1.9073486e-06;
      auVar271._0_4_ = -(uint)(ABS(local_2b8) < fVar155 && bVar52);
      auVar271._4_4_ = -(uint)(ABS(fStack_2b4) < fVar166 && bVar9);
      auVar271._8_4_ = -(uint)(ABS(fStack_2b0) < fVar167 && bVar10);
      auVar271._12_4_ = -(uint)(ABS(fStack_2ac) < fVar168 && bVar11);
      iVar40 = movmskps(iVar40,auVar271);
      if (iVar40 != 0) {
        uVar54 = -(uint)(fVar104 <= 0.0);
        uVar55 = -(uint)(fVar124 <= 0.0);
        uVar56 = -(uint)(fVar126 <= 0.0);
        uVar57 = -(uint)(fVar138 <= 0.0);
        auVar181._0_4_ = (uVar54 & 0xff800000 | ~uVar54 & 0x7f800000) & auVar271._0_4_;
        auVar181._4_4_ = (uVar55 & 0xff800000 | ~uVar55 & 0x7f800000) & auVar271._4_4_;
        auVar181._8_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar271._8_4_;
        auVar181._12_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar271._12_4_;
        auVar122._0_4_ = ~auVar271._0_4_ & auVar284._0_4_;
        auVar122._4_4_ = ~auVar271._4_4_ & auVar284._4_4_;
        auVar122._8_4_ = ~auVar271._8_4_ & auVar284._8_4_;
        auVar122._12_4_ = ~auVar271._12_4_ & auVar284._12_4_;
        auVar284 = auVar122 | auVar181;
        auVar290._0_4_ = (uVar54 & 0x7f800000 | ~uVar54 & 0xff800000) & auVar271._0_4_;
        auVar290._4_4_ = (uVar55 & 0x7f800000 | ~uVar55 & 0xff800000) & auVar271._4_4_;
        auVar290._8_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar271._8_4_;
        auVar290._12_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar271._12_4_;
        auVar273._0_4_ = ~auVar271._0_4_ & auVar228._0_4_;
        auVar273._4_4_ = ~auVar271._4_4_ & auVar228._4_4_;
        auVar273._8_4_ = ~auVar271._8_4_ & auVar228._8_4_;
        auVar273._12_4_ = ~auVar271._12_4_ & auVar228._12_4_;
        auVar228 = auVar273 | auVar290;
        auVar175._4_4_ = -(uint)((fVar166 <= ABS(fStack_2b4) || fVar124 <= 0.0) && bVar9);
        auVar175._0_4_ = -(uint)((fVar155 <= ABS(local_2b8) || fVar104 <= 0.0) && bVar52);
        auVar175._8_4_ = -(uint)((fVar167 <= ABS(fStack_2b0) || fVar126 <= 0.0) && bVar10);
        auVar175._12_4_ = -(uint)((fVar168 <= ABS(fStack_2ac) || fVar138 <= 0.0) && bVar11);
      }
    }
    auVar176._0_4_ = (auVar175._0_4_ << 0x1f) >> 0x1f;
    auVar176._4_4_ = (auVar175._4_4_ << 0x1f) >> 0x1f;
    auVar176._8_4_ = (auVar175._8_4_ << 0x1f) >> 0x1f;
    auVar176._12_4_ = (auVar175._12_4_ << 0x1f) >> 0x1f;
    auVar176 = auVar176 & local_1d8;
    iVar40 = movmskps(iVar40,auVar176);
    pauVar46 = (undefined1 (*) [16])CONCAT44(uVar47,iVar40);
    if (iVar40 != 0) {
      auVar217._0_4_ = (ray->org).field_0.m128[3] - (float)local_2d8._0_4_;
      auVar217._4_4_ = auVar217._0_4_;
      auVar217._8_4_ = auVar217._0_4_;
      auVar217._12_4_ = auVar217._0_4_;
      auVar234 = maxps(auVar217,auVar284);
      auVar252._0_4_ = ray->tfar - (float)local_2d8._0_4_;
      auVar252._4_4_ = auVar252._0_4_;
      auVar252._8_4_ = auVar252._0_4_;
      auVar252._12_4_ = auVar252._0_4_;
      auVar174 = minps(auVar252,auVar228);
      auVar83._0_4_ = local_388 * fVar103 + (float)local_3d8._0_4_ * auVar272._0_4_;
      auVar83._4_4_ = fStack_384 * fVar103 + (float)local_3d8._4_4_ * auVar272._4_4_;
      auVar83._8_4_ = fStack_380 * fVar103 + fStack_3d0 * auVar272._8_4_;
      auVar83._12_4_ = fStack_37c * fVar103 + fStack_3cc * auVar272._12_4_;
      auVar237._0_4_ = fVar262 * local_298 + auVar83._0_4_;
      auVar237._4_4_ = local_3c8 * fStack_294 + auVar83._4_4_;
      auVar237._8_4_ = fStack_3c4 * fStack_290 + auVar83._8_4_;
      auVar237._12_4_ = fStack_3c0 * fStack_28c + auVar83._12_4_;
      auVar69 = rcpps(auVar83,auVar237);
      fVar104 = auVar69._0_4_;
      fVar124 = auVar69._4_4_;
      fVar126 = auVar69._8_4_;
      fVar138 = auVar69._12_4_;
      fVar104 = ((1.0 - auVar237._0_4_ * fVar104) * fVar104 + fVar104) *
                -(fVar222 * fVar262 + fVar139 * local_388 + fVar196 * (float)local_3d8._0_4_);
      fVar124 = ((1.0 - auVar237._4_4_ * fVar124) * fVar124 + fVar124) *
                -(fVar230 * local_3c8 + fVar141 * fStack_384 + fVar197 * (float)local_3d8._4_4_);
      fVar126 = ((1.0 - auVar237._8_4_ * fVar126) * fVar126 + fVar126) *
                -(fVar231 * fStack_3c4 + fVar153 * fStack_380 + fVar220 * fStack_3d0);
      fVar138 = ((1.0 - auVar237._12_4_ * fVar138) * fVar138 + fVar138) *
                -(fVar232 * fStack_3c0 + fVar154 * fStack_37c + fVar221 * fStack_3cc);
      uVar54 = -(uint)(auVar237._0_4_ < 0.0 || ABS(auVar237._0_4_) < 1e-18);
      uVar55 = -(uint)(auVar237._4_4_ < 0.0 || ABS(auVar237._4_4_) < 1e-18);
      uVar56 = -(uint)(auVar237._8_4_ < 0.0 || ABS(auVar237._8_4_) < 1e-18);
      uVar57 = -(uint)(auVar237._12_4_ < 0.0 || ABS(auVar237._12_4_) < 1e-18);
      auVar159._0_8_ = CONCAT44(uVar55,uVar54) & 0xff800000ff800000;
      auVar159._8_4_ = uVar56 & 0xff800000;
      auVar159._12_4_ = uVar57 & 0xff800000;
      auVar84._0_4_ = ~uVar54 & (uint)fVar104;
      auVar84._4_4_ = ~uVar55 & (uint)fVar124;
      auVar84._8_4_ = ~uVar56 & (uint)fVar126;
      auVar84._12_4_ = ~uVar57 & (uint)fVar138;
      auVar234 = maxps(auVar234,auVar84 | auVar159);
      uVar54 = -(uint)(0.0 < auVar237._0_4_ || ABS(auVar237._0_4_) < 1e-18);
      uVar55 = -(uint)(0.0 < auVar237._4_4_ || ABS(auVar237._4_4_) < 1e-18);
      uVar56 = -(uint)(0.0 < auVar237._8_4_ || ABS(auVar237._8_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar237._12_4_ || ABS(auVar237._12_4_) < 1e-18);
      auVar85._0_8_ = CONCAT44(uVar55,uVar54) & 0x7f8000007f800000;
      auVar85._8_4_ = uVar56 & 0x7f800000;
      auVar85._12_4_ = uVar57 & 0x7f800000;
      auVar238._0_4_ = ~uVar54 & (uint)fVar104;
      auVar238._4_4_ = ~uVar55 & (uint)fVar124;
      auVar238._8_4_ = ~uVar56 & (uint)fVar126;
      auVar238._12_4_ = ~uVar57 & (uint)fVar138;
      auVar174 = minps(auVar174,auVar238 | auVar85);
      auVar112._0_4_ = (0.0 - fVar280) * -fStack_384 + (0.0 - fVar263) * -(float)local_3d8._4_4_;
      auVar112._4_4_ = (0.0 - fVar281) * -fStack_380 + (0.0 - fVar265) * -fStack_3d0;
      auVar112._8_4_ = (0.0 - fVar282) * -fStack_37c + (0.0 - fVar267) * -fStack_3cc;
      auVar112._12_4_ = 0x80000000;
      auVar128._0_4_ =
           -local_3c8 * local_298 + -fStack_384 * fVar103 + -(float)local_3d8._4_4_ * auVar272._0_4_
      ;
      auVar128._4_4_ =
           -fStack_3c4 * fStack_294 + -fStack_380 * fVar103 + -fStack_3d0 * auVar272._4_4_;
      auVar128._8_4_ =
           -fStack_3c0 * fStack_290 + -fStack_37c * fVar103 + -fStack_3cc * auVar272._8_4_;
      auVar128._12_4_ = fStack_28c * -0.0 + fVar103 * -0.0 + auVar272._12_4_ * -0.0;
      auVar69 = rcpps(auVar112,auVar128);
      fVar104 = auVar69._0_4_;
      fVar124 = auVar69._4_4_;
      fVar126 = auVar69._8_4_;
      fVar138 = auVar69._12_4_;
      fVar104 = (((float)DAT_01f7ba10 - auVar128._0_4_ * fVar104) * fVar104 + fVar104) *
                -((0.0 - fVar275) * -local_3c8 + auVar112._0_4_);
      fVar124 = ((DAT_01f7ba10._4_4_ - auVar128._4_4_ * fVar124) * fVar124 + fVar124) *
                -((0.0 - fVar277) * -fStack_3c4 + auVar112._4_4_);
      fVar126 = ((DAT_01f7ba10._8_4_ - auVar128._8_4_ * fVar126) * fVar126 + fVar126) *
                -((0.0 - fVar278) * -fStack_3c0 + auVar112._8_4_);
      fVar138 = ((DAT_01f7ba10._12_4_ - auVar128._12_4_ * fVar138) * fVar138 + fVar138) * 0.0;
      uVar54 = -(uint)(auVar128._0_4_ < 0.0 || ABS(auVar128._0_4_) < 1e-18);
      uVar55 = -(uint)(auVar128._4_4_ < 0.0 || ABS(auVar128._4_4_) < 1e-18);
      uVar56 = -(uint)(auVar128._8_4_ < 0.0 || ABS(auVar128._8_4_) < 1e-18);
      uVar57 = -(uint)(auVar128._12_4_ < 0.0 || ABS(auVar128._12_4_) < 1e-18);
      auVar113._0_8_ = CONCAT44(uVar55,uVar54) & 0xff800000ff800000;
      auVar113._8_4_ = uVar56 & 0xff800000;
      auVar113._12_4_ = uVar57 & 0xff800000;
      auVar86._0_4_ = ~uVar54 & (uint)fVar104;
      auVar86._4_4_ = ~uVar55 & (uint)fVar124;
      auVar86._8_4_ = ~uVar56 & (uint)fVar126;
      auVar86._12_4_ = ~uVar57 & (uint)fVar138;
      auVar69 = maxps(auVar234,auVar86 | auVar113);
      uVar54 = -(uint)(0.0 < auVar128._0_4_ || ABS(auVar128._0_4_) < 1e-18);
      uVar55 = -(uint)(0.0 < auVar128._4_4_ || ABS(auVar128._4_4_) < 1e-18);
      uVar56 = -(uint)(0.0 < auVar128._8_4_ || ABS(auVar128._8_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar128._12_4_ || ABS(auVar128._12_4_) < 1e-18);
      auVar87._0_8_ = CONCAT44(uVar55,uVar54) & 0x7f8000007f800000;
      auVar87._8_4_ = uVar56 & 0x7f800000;
      auVar87._12_4_ = uVar57 & 0x7f800000;
      auVar129._0_4_ = ~uVar54 & (uint)fVar104;
      auVar129._4_4_ = ~uVar55 & (uint)fVar124;
      auVar129._8_4_ = ~uVar56 & (uint)fVar126;
      auVar129._12_4_ = ~uVar57 & (uint)fVar138;
      local_268 = minps(auVar174,auVar129 | auVar87);
      fVar104 = auVar69._12_4_;
      fVar124 = auVar69._0_4_;
      fVar126 = auVar69._4_4_;
      fVar138 = auVar69._8_4_;
      auVar244._0_4_ = -(uint)(fVar124 <= local_268._0_4_) & auVar176._0_4_;
      auVar244._4_4_ = -(uint)(fVar126 <= local_268._4_4_) & auVar176._4_4_;
      auVar244._8_4_ = -(uint)(fVar138 <= local_268._8_4_) & auVar176._8_4_;
      auVar244._12_4_ = -(uint)(fVar104 <= local_268._12_4_) & auVar176._12_4_;
      iVar40 = movmskps(iVar40,auVar244);
      pauVar46 = (undefined1 (*) [16])CONCAT44(uVar47,iVar40);
      if (iVar40 != 0) {
        auVar16._4_4_ = fStack_424;
        auVar16._0_4_ = local_428;
        auVar16._8_4_ = fStack_420;
        auVar16._12_4_ = fStack_41c;
        auVar234 = maxps(ZEXT816(0),auVar16);
        auVar23._4_4_ = fStack_1e4;
        auVar23._0_4_ = local_1e8;
        auVar23._8_4_ = fStack_1e0;
        auVar23._12_4_ = fStack_1dc;
        auVar174 = minps(auVar23,_DAT_01f7ba10);
        auVar160._0_12_ = ZEXT812(0);
        auVar160._12_4_ = 0.0;
        auVar236 = maxps(auVar174,auVar160);
        auVar174 = minps(_local_458,_DAT_01f7ba10);
        auVar174 = maxps(auVar174,auVar160);
        local_108._0_4_ = (auVar236._0_4_ + 0.0) * 0.25 * local_408 + local_1c8;
        local_108._4_4_ = (auVar236._4_4_ + 1.0) * 0.25 * local_408 + local_1c8;
        local_108._8_4_ = (auVar236._8_4_ + 2.0) * 0.25 * local_408 + local_1c8;
        local_108._12_4_ = (auVar236._12_4_ + 3.0) * 0.25 * local_408 + local_1c8;
        local_118[0] = (auVar174._0_4_ + 0.0) * 0.25 * local_408 + local_1c8;
        local_118[1] = (auVar174._4_4_ + 1.0) * 0.25 * local_408 + local_1c8;
        local_118[2] = (auVar174._8_4_ + 2.0) * 0.25 * local_408 + local_1c8;
        local_118[3] = (auVar174._12_4_ + 3.0) * 0.25 * local_408 + local_1c8;
        auVar114._0_4_ = fVar241 - auVar234._0_4_ * auVar234._0_4_;
        auVar114._4_4_ = fVar242 - auVar234._4_4_ * auVar234._4_4_;
        auVar114._8_4_ = fVar243 - auVar234._8_4_ * auVar234._8_4_;
        auVar114._12_4_ = fVar245 - auVar234._12_4_ * auVar234._12_4_;
        auVar253._0_4_ = local_438 - local_2b8 * 4.0 * auVar114._0_4_;
        auVar253._4_4_ = fStack_434 - fStack_2b4 * 4.0 * auVar114._4_4_;
        auVar253._8_4_ = fStack_430 - fStack_2b0 * 4.0 * auVar114._8_4_;
        auVar253._12_4_ = fStack_42c - fStack_2ac * 4.0 * auVar114._12_4_;
        local_458._4_4_ = -(uint)(0.0 <= auVar253._4_4_);
        local_458._0_4_ = -(uint)(0.0 <= auVar253._0_4_);
        fStack_450 = (float)-(uint)(0.0 <= auVar253._8_4_);
        fStack_44c = (float)-(uint)(0.0 <= auVar253._12_4_);
        iVar40 = movmskps(iVar40,_local_458);
        if (iVar40 == 0) {
          _local_548 = ZEXT816(0);
          fVar155 = 0.0;
          fVar166 = 0.0;
          fVar167 = 0.0;
          fVar168 = 0.0;
          fVar139 = 0.0;
          fVar141 = 0.0;
          fVar153 = 0.0;
          fVar154 = 0.0;
          fVar196 = 0.0;
          fVar197 = 0.0;
          fVar220 = 0.0;
          fVar221 = 0.0;
          _local_4d8 = ZEXT816(0);
          iVar40 = 0;
          auVar115 = _DAT_01f7aa00;
          auVar145 = _DAT_01f7a9f0;
        }
        else {
          auVar174 = sqrtps(local_108,auVar253);
          auVar88._0_4_ = local_2b8 + local_2b8;
          auVar88._4_4_ = fStack_2b4 + fStack_2b4;
          auVar88._8_4_ = fStack_2b0 + fStack_2b0;
          auVar88._12_4_ = fStack_2ac + fStack_2ac;
          auVar234 = rcpps(auVar114,auVar88);
          fVar222 = auVar234._0_4_;
          fVar230 = auVar234._4_4_;
          fVar231 = auVar234._8_4_;
          fVar232 = auVar234._12_4_;
          fVar222 = ((float)DAT_01f7ba10 - auVar88._0_4_ * fVar222) * fVar222 + fVar222;
          fVar230 = (DAT_01f7ba10._4_4_ - auVar88._4_4_ * fVar230) * fVar230 + fVar230;
          fVar231 = (DAT_01f7ba10._8_4_ - auVar88._8_4_ * fVar231) * fVar231 + fVar231;
          fVar232 = (DAT_01f7ba10._12_4_ - auVar88._12_4_ * fVar232) * fVar232 + fVar232;
          fVar241 = (-auVar192._0_4_ - auVar174._0_4_) * fVar222;
          fVar242 = (-auVar192._4_4_ - auVar174._4_4_) * fVar230;
          fVar243 = (-auVar192._8_4_ - auVar174._8_4_) * fVar231;
          fVar245 = (-auVar192._12_4_ - auVar174._12_4_) * fVar232;
          fVar222 = (auVar174._0_4_ - auVar192._0_4_) * fVar222;
          fVar230 = (auVar174._4_4_ - auVar192._4_4_) * fVar230;
          fVar231 = (auVar174._8_4_ - auVar192._8_4_) * fVar231;
          fVar232 = (auVar174._12_4_ - auVar192._12_4_) * fVar232;
          fVar155 = (local_238 * fVar241 + fVar246) * local_308;
          fVar166 = (fStack_234 * fVar242 + fVar249) * fStack_304;
          fVar167 = (fStack_230 * fVar243 + fVar254) * fStack_300;
          fVar168 = (fStack_22c * fVar245 + fVar256) * fStack_2fc;
          fVar139 = local_298 * fVar241 - ((float)local_2f8._0_4_ * fVar155 + fVar269);
          fVar141 = fStack_294 * fVar242 - ((float)local_2f8._4_4_ * fVar166 + fVar275);
          fVar153 = fStack_290 * fVar243 - (fStack_2f0 * fVar167 + fVar277);
          fVar154 = fStack_28c * fVar245 - (fStack_2ec * fVar168 + fVar278);
          fVar196 = fVar103 * fVar241 - (fVar184 * fVar155 + fVar279);
          fVar197 = fVar103 * fVar242 - (fVar140 * fVar166 + fVar280);
          fVar220 = fVar103 * fVar243 - (fVar185 * fVar167 + fVar281);
          fVar221 = fVar103 * fVar245 - (fVar195 * fVar168 + fVar282);
          local_4d8._4_4_ = fStack_444 * fVar242 - (fVar166 * (float)local_2e8._4_4_ + fVar263);
          local_4d8._0_4_ = local_448 * fVar241 - (fVar155 * (float)local_2e8._0_4_ + fVar261);
          fStack_4d0 = fStack_440 * fVar243 - (fVar167 * fStack_2e0 + fVar265);
          fStack_4cc = fStack_43c * fVar245 - (fVar168 * fStack_2dc + fVar267);
          local_308 = (local_238 * fVar222 + fVar246) * local_308;
          fStack_304 = (fStack_234 * fVar230 + fVar249) * fStack_304;
          fStack_300 = (fStack_230 * fVar231 + fVar254) * fStack_300;
          fStack_2fc = (fStack_22c * fVar232 + fVar256) * fStack_2fc;
          local_548._4_4_ = fStack_294 * fVar230 - ((float)local_2f8._4_4_ * fStack_304 + fVar275);
          local_548._0_4_ = local_298 * fVar222 - ((float)local_2f8._0_4_ * local_308 + fVar269);
          fStack_540 = fStack_290 * fVar231 - (fStack_2f0 * fStack_300 + fVar277);
          fStack_53c = fStack_28c * fVar232 - (fStack_2ec * fStack_2fc + fVar278);
          fVar155 = fVar103 * fVar222 - (fVar184 * local_308 + fVar279);
          fVar166 = fVar103 * fVar230 - (fVar140 * fStack_304 + fVar280);
          fVar167 = fVar103 * fVar231 - (fVar185 * fStack_300 + fVar281);
          fVar168 = fVar103 * fVar232 - (fVar195 * fStack_2fc + fVar282);
          bVar52 = 0.0 <= auVar253._0_4_;
          uVar54 = -(uint)bVar52;
          bVar9 = 0.0 <= auVar253._4_4_;
          uVar55 = -(uint)bVar9;
          bVar10 = 0.0 <= auVar253._8_4_;
          uVar56 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar253._12_4_;
          uVar57 = -(uint)bVar11;
          auVar160._0_4_ = local_448 * fVar222 - (local_308 * (float)local_2e8._0_4_ + fVar261);
          auVar160._4_4_ = fStack_444 * fVar230 - (fStack_304 * (float)local_2e8._4_4_ + fVar263);
          auVar160._8_4_ = fStack_440 * fVar231 - (fStack_300 * fStack_2e0 + fVar265);
          auVar160._12_4_ = fStack_43c * fVar232 - (fStack_2fc * fStack_2dc + fVar267);
          auVar194._0_4_ = (uint)fVar241 & uVar54;
          auVar194._4_4_ = (uint)fVar242 & uVar55;
          auVar194._8_4_ = (uint)fVar243 & uVar56;
          auVar194._12_4_ = (uint)fVar245 & uVar57;
          auVar145._0_8_ = CONCAT44(~uVar55,~uVar54) & 0x7f8000007f800000;
          auVar145._8_4_ = ~uVar56 & 0x7f800000;
          auVar145._12_4_ = ~uVar57 & 0x7f800000;
          auVar145 = auVar145 | auVar194;
          auVar218._0_4_ = (uint)fVar222 & uVar54;
          auVar218._4_4_ = (uint)fVar230 & uVar55;
          auVar218._8_4_ = (uint)fVar231 & uVar56;
          auVar218._12_4_ = (uint)fVar232 & uVar57;
          auVar115._0_8_ = CONCAT44(~uVar55,~uVar54) & 0xff800000ff800000;
          auVar115._8_4_ = ~uVar56 & 0xff800000;
          auVar115._12_4_ = ~uVar57 & 0xff800000;
          auVar115 = auVar115 | auVar218;
          auVar177._0_8_ = CONCAT44(fStack_244,local_248) & 0x7fffffff7fffffff;
          auVar177._8_4_ = ABS(fStack_240);
          auVar177._12_4_ = ABS(fStack_23c);
          auVar22._4_4_ = fStack_2a4;
          auVar22._0_4_ = local_2a8;
          auVar22._8_4_ = fStack_2a0;
          auVar22._12_4_ = fStack_29c;
          auVar234 = maxps(auVar22,auVar177);
          fVar184 = auVar234._0_4_ * 1.9073486e-06;
          fVar140 = auVar234._4_4_ * 1.9073486e-06;
          fVar185 = auVar234._8_4_ * 1.9073486e-06;
          fVar195 = auVar234._12_4_ * 1.9073486e-06;
          auVar178._0_4_ = -(uint)(ABS(local_2b8) < fVar184 && bVar52);
          auVar178._4_4_ = -(uint)(ABS(fStack_2b4) < fVar140 && bVar9);
          auVar178._8_4_ = -(uint)(ABS(fStack_2b0) < fVar185 && bVar10);
          auVar178._12_4_ = -(uint)(ABS(fStack_2ac) < fVar195 && bVar11);
          iVar40 = movmskps(iVar40,auVar178);
          if (iVar40 != 0) {
            uVar54 = -(uint)(auVar114._0_4_ <= 0.0);
            uVar55 = -(uint)(auVar114._4_4_ <= 0.0);
            uVar56 = -(uint)(auVar114._8_4_ <= 0.0);
            uVar57 = -(uint)(auVar114._12_4_ <= 0.0);
            auVar239._0_4_ = (uVar54 & 0xff800000 | ~uVar54 & 0x7f800000) & auVar178._0_4_;
            auVar239._4_4_ = (uVar55 & 0xff800000 | ~uVar55 & 0x7f800000) & auVar178._4_4_;
            auVar239._8_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar178._8_4_;
            auVar239._12_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar178._12_4_;
            auVar229._0_4_ = ~auVar178._0_4_ & auVar145._0_4_;
            auVar229._4_4_ = ~auVar178._4_4_ & auVar145._4_4_;
            auVar229._8_4_ = ~auVar178._8_4_ & auVar145._8_4_;
            auVar229._12_4_ = ~auVar178._12_4_ & auVar145._12_4_;
            auVar145 = auVar229 | auVar239;
            auVar240._0_4_ = (uVar54 & 0x7f800000 | ~uVar54 & 0xff800000) & auVar178._0_4_;
            auVar240._4_4_ = (uVar55 & 0x7f800000 | ~uVar55 & 0xff800000) & auVar178._4_4_;
            auVar240._8_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar178._8_4_;
            auVar240._12_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar178._12_4_;
            auVar182._0_4_ = ~auVar178._0_4_ & auVar115._0_4_;
            auVar182._4_4_ = ~auVar178._4_4_ & auVar115._4_4_;
            auVar182._8_4_ = ~auVar178._8_4_ & auVar115._8_4_;
            auVar182._12_4_ = ~auVar178._12_4_ & auVar115._12_4_;
            auVar115 = auVar182 | auVar240;
            local_458._4_4_ =
                 -(uint)((fVar140 <= ABS(fStack_2b4) || auVar114._4_4_ <= 0.0) && bVar9);
            local_458._0_4_ =
                 -(uint)((fVar184 <= ABS(local_2b8) || auVar114._0_4_ <= 0.0) && bVar52);
            fStack_450 = (float)-(uint)((fVar185 <= ABS(fStack_2b0) || auVar114._8_4_ <= 0.0) &&
                                       bVar10);
            fStack_44c = (float)-(uint)((fVar195 <= ABS(fStack_2ac) || auVar114._12_4_ <= 0.0) &&
                                       bVar11);
          }
        }
        fVar184 = (ray->dir).field_0.m128[0];
        fVar140 = (ray->dir).field_0.m128[1];
        fVar185 = (ray->dir).field_0.m128[2];
        _local_138 = auVar69;
        local_128 = minps(local_268,auVar145);
        _local_4c8 = maxps(auVar69,auVar115);
        _local_278 = _local_4c8;
        local_2e8._0_4_ = -(uint)(fVar124 <= local_128._0_4_) & auVar244._0_4_;
        local_2e8._4_4_ = -(uint)(fVar126 <= local_128._4_4_) & auVar244._4_4_;
        fStack_2e0 = (float)(-(uint)(fVar138 <= local_128._8_4_) & auVar244._8_4_);
        fStack_2dc = (float)(-(uint)(fVar104 <= local_128._12_4_) & auVar244._12_4_);
        local_2f8 = (undefined1  [8])
                    CONCAT44(-(uint)((float)local_4c8._4_4_ <= local_268._4_4_) & auVar244._4_4_,
                             -(uint)((float)local_4c8._0_4_ <= local_268._0_4_) & auVar244._0_4_);
        fStack_2f0 = (float)(-(uint)(fStack_4c0 <= local_268._8_4_) & auVar244._8_4_);
        fStack_2ec = (float)(-(uint)(fStack_4bc <= local_268._12_4_) & auVar244._12_4_);
        auVar130._8_4_ = fStack_2f0;
        auVar130._0_8_ = local_2f8;
        auVar130._12_4_ = fStack_2ec;
        iVar40 = movmskps(iVar40,auVar130 | _local_2e8);
        pauVar46 = (undefined1 (*) [16])CONCAT44(uVar47,iVar40);
        if (iVar40 != 0) {
          local_308 = (float)local_5bc;
          fStack_304 = (float)local_5bc;
          fStack_300 = (float)local_5bc;
          fStack_2fc = (float)local_5bc;
          local_4d8._0_4_ =
               -(uint)(local_5bc <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4d8._0_4_ * fVar185 +
                                                 fVar196 * fVar140 + fVar139 * fVar184)) &
                             local_458._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4d8._4_4_ =
               -(uint)(local_5bc <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4d8._4_4_ * fVar185 +
                                                 fVar197 * fVar140 + fVar141 * fVar184)) &
                             local_458._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4d0 = (float)-(uint)(local_5bc <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4d0 * fVar185 +
                                                                fVar220 * fVar140 +
                                                                fVar153 * fVar184)) &
                                            (uint)fStack_450) << 0x1f) >> 0x1f) + 4);
          fStack_4cc = (float)-(uint)(local_5bc <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4cc * fVar185 +
                                                                fVar221 * fVar140 +
                                                                fVar154 * fVar184)) &
                                            (uint)fStack_44c) << 0x1f) >> 0x1f) + 4);
          local_2c8 = ~_local_4d8 & _local_2e8;
          iVar40 = movmskps(iVar40,local_2c8);
          if (iVar40 == 0) {
            fVar104 = ray->tfar;
            auVar219._4_4_ = fVar59;
            auVar219._0_4_ = fVar125;
            auVar219._8_4_ = fVar102;
            auVar219._12_4_ = fVar183;
            fVar124 = (float)local_4c8._0_4_;
            fVar126 = (float)local_4c8._4_4_;
            fVar138 = fStack_4c0;
            fVar139 = fStack_4bc;
          }
          else {
            local_438 = local_4b8 + fVar124;
            fStack_434 = fStack_4b4 + fVar126;
            fStack_430 = fStack_4b0 + fVar138;
            fStack_42c = fStack_4ac + fVar104;
            auVar219._4_4_ = fVar59;
            auVar219._0_4_ = fVar125;
            auVar219._8_4_ = fVar102;
            auVar219._12_4_ = fVar183;
            do {
              auVar174 = ~local_2c8 & _DAT_01f7a9f0 | local_2c8 & auVar69;
              auVar146._4_4_ = auVar174._0_4_;
              auVar146._0_4_ = auVar174._4_4_;
              auVar146._8_4_ = auVar174._12_4_;
              auVar146._12_4_ = auVar174._8_4_;
              auVar234 = minps(auVar146,auVar174);
              auVar89._0_8_ = auVar234._8_8_;
              auVar89._8_4_ = auVar234._0_4_;
              auVar89._12_4_ = auVar234._4_4_;
              auVar234 = minps(auVar89,auVar234);
              auVar90._0_8_ =
                   CONCAT44(-(uint)(auVar234._4_4_ == auVar174._4_4_) & local_2c8._4_4_,
                            -(uint)(auVar234._0_4_ == auVar174._0_4_) & local_2c8._0_4_);
              auVar90._8_4_ = -(uint)(auVar234._8_4_ == auVar174._8_4_) & local_2c8._8_4_;
              auVar90._12_4_ = -(uint)(auVar234._12_4_ == auVar174._12_4_) & local_2c8._12_4_;
              iVar40 = movmskps(iVar40,auVar90);
              auVar116 = local_2c8;
              if (iVar40 != 0) {
                auVar116._8_4_ = auVar90._8_4_;
                auVar116._0_8_ = auVar90._0_8_;
                auVar116._12_4_ = auVar90._12_4_;
              }
              uVar41 = movmskps(iVar40,auVar116);
              lVar43 = 0;
              if (CONCAT44(uVar47,uVar41) != 0) {
                for (; (CONCAT44(uVar47,uVar41) >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                }
              }
              *(undefined4 *)(local_2c8 + lVar43 * 4) = 0;
              fVar104 = (ray->dir).field_0.m128[0];
              fVar124 = (ray->dir).field_0.m128[1];
              fVar126 = (ray->dir).field_0.m128[2];
              fVar138 = (ray->dir).field_0.m128[3];
              auVar14._4_4_ = fStack_494;
              auVar14._0_4_ = local_498;
              auVar14._8_4_ = fStack_490;
              auVar14._12_4_ = fStack_48c;
              auVar19._4_4_ = fStack_314;
              auVar19._0_4_ = local_318;
              auVar19._8_4_ = fStack_310;
              auVar19._12_4_ = fStack_30c;
              auVar174 = minps(auVar14,auVar19);
              auVar236 = maxps(auVar14,auVar19);
              auVar17._4_4_ = fStack_324;
              auVar17._0_4_ = local_328;
              auVar17._8_4_ = fStack_320;
              auVar17._12_4_ = fStack_31c;
              auVar234 = minps(auVar17,auVar219);
              auVar174 = minps(auVar174,auVar234);
              auVar234 = maxps(auVar17,auVar219);
              auVar234 = maxps(auVar236,auVar234);
              auVar131._0_8_ = auVar174._0_8_ & 0x7fffffff7fffffff;
              auVar131._8_4_ = auVar174._8_4_ & 0x7fffffff;
              auVar131._12_4_ = auVar174._12_4_ & 0x7fffffff;
              local_428 = auVar234._12_4_;
              auVar91._0_8_ = auVar234._0_8_ & 0x7fffffff7fffffff;
              auVar91._8_4_ = auVar234._8_4_ & 0x7fffffff;
              auVar91._12_4_ = ABS(local_428);
              auVar234 = maxps(auVar131,auVar91);
              fVar139 = auVar234._4_4_;
              if (auVar234._4_4_ <= auVar234._0_4_) {
                fVar139 = auVar234._0_4_;
              }
              auVar132._8_8_ = auVar234._8_8_;
              auVar132._0_8_ = auVar234._8_8_;
              if (auVar234._8_4_ <= fVar139) {
                auVar132._0_4_ = fVar139;
              }
              register0x00001284 = auVar132._4_12_;
              local_3a8._0_4_ = auVar132._0_4_ * 1.9073486e-06;
              local_398._0_4_ =
                   SQRT(fVar126 * fVar126 + fVar124 * fVar124 + fVar104 * fVar104) * 1.9073486e-06;
              fStack_424 = local_428;
              fStack_420 = local_428;
              fStack_41c = local_428;
              fVar139 = *(float *)(local_108 + lVar43 * 4);
              fVar141 = *(float *)(local_138 + lVar43 * 4);
              bVar52 = true;
              uVar42 = 0;
              do {
                fVar153 = 1.0 - fVar139;
                fVar195 = local_318 * fVar153 + local_328 * fVar139;
                fVar196 = fStack_314 * fVar153 + fStack_324 * fVar139;
                fVar197 = fStack_310 * fVar153 + fStack_320 * fVar139;
                fVar221 = fStack_30c * fVar153 + fStack_31c * fVar139;
                fVar220 = (local_498 * fVar153 + local_318 * fVar139) * fVar153 + fVar139 * fVar195;
                fVar222 = (fStack_494 * fVar153 + fStack_314 * fVar139) * fVar153 +
                          fVar139 * fVar196;
                fVar230 = (fStack_490 * fVar153 + fStack_310 * fVar139) * fVar153 +
                          fVar139 * fVar197;
                fVar154 = (fStack_48c * fVar153 + fStack_30c * fVar139) * fVar153 +
                          fVar139 * fVar221;
                fVar241 = fVar195 * fVar153 +
                          (local_328 * fVar153 + auVar219._0_4_ * fVar139) * fVar139;
                fVar242 = fVar196 * fVar153 +
                          (fStack_324 * fVar153 + auVar219._4_4_ * fVar139) * fVar139;
                fVar243 = fVar197 * fVar153 +
                          (fStack_320 * fVar153 + auVar219._8_4_ * fVar139) * fVar139;
                fVar195 = fVar221 * fVar153 +
                          (fStack_31c * fVar153 + auVar219._12_4_ * fVar139) * fVar139;
                fVar232 = fVar153 * fVar154 + fVar139 * fVar195;
                local_4a8 = (fVar241 - fVar220) * 3.0;
                fStack_4a4 = (fVar242 - fVar222) * 3.0;
                fStack_4a0 = (fVar243 - fVar230) * 3.0;
                fStack_49c = (fVar195 - fVar154) * 3.0;
                fVar154 = fVar153 * 6.0;
                fVar221 = (fVar139 - (fVar153 + fVar153)) * 6.0;
                fVar231 = (fVar153 - (fVar139 + fVar139)) * 6.0;
                fVar197 = fVar139 * 6.0;
                fVar195 = fVar154 * local_498 +
                          fVar221 * local_318 + fVar231 * local_328 + fVar197 * auVar219._0_4_;
                fVar196 = fVar154 * fStack_494 +
                          fVar221 * fStack_314 + fVar231 * fStack_324 + fVar197 * auVar219._4_4_;
                fVar154 = fVar154 * fStack_490 +
                          fVar221 * fStack_310 + fVar231 * fStack_320 + fVar197 * auVar219._8_4_;
                fVar197 = (fVar141 * fVar104 + 0.0) - (fVar153 * fVar220 + fVar139 * fVar241);
                fVar220 = (fVar141 * fVar124 + 0.0) - (fVar153 * fVar222 + fVar139 * fVar242);
                fVar221 = (fVar141 * fVar126 + 0.0) - (fVar153 * fVar230 + fVar139 * fVar243);
                fStack_3bc = (fVar141 * fVar138 + 0.0) - fVar232;
                fVar153 = fVar220 * fVar220;
                fStack_3b0 = fVar221 * fVar221;
                fStack_3ac = fStack_3bc * fStack_3bc;
                local_3b8._0_4_ = fVar153 + fVar197 * fVar197 + fStack_3b0;
                local_3b8._4_4_ = fVar153 + fVar153 + fStack_3ac;
                fStack_3b0 = fVar153 + fStack_3b0 + fStack_3b0;
                fStack_3ac = fVar153 + fStack_3ac + fStack_3ac;
                local_388 = (float)local_3a8._0_4_;
                if ((float)local_3a8._0_4_ <= (float)local_398._0_4_ * fVar141) {
                  local_388 = (float)local_398._0_4_ * fVar141;
                }
                fVar249 = -local_4a8;
                fVar254 = -fStack_4a4;
                fVar256 = -fStack_4a0;
                fVar230 = fStack_4a4 * fStack_4a4 + local_4a8 * local_4a8 + fStack_4a0 * fStack_4a0;
                auVar234 = ZEXT416((uint)fVar230);
                auVar174 = rsqrtss(ZEXT416((uint)fVar230),auVar234);
                fVar153 = auVar174._0_4_;
                fVar231 = fVar153 * 1.5 - fVar153 * fVar153 * fVar230 * 0.5 * fVar153;
                fVar260 = local_4a8 * fVar231;
                fVar262 = fStack_4a4 * fVar231;
                fVar264 = fStack_4a0 * fVar231;
                fVar266 = fStack_49c * fVar231;
                fVar243 = fStack_4a0 * fVar154 + fStack_4a4 * fVar196 + local_4a8 * fVar195;
                auVar234 = rcpss(auVar234,auVar234);
                fVar153 = (2.0 - fVar230 * auVar234._0_4_) * auVar234._0_4_;
                fVar222 = fVar220 * fVar262;
                fVar241 = fVar221 * fVar264;
                fVar242 = fStack_3bc * fVar266;
                fVar245 = fVar222 + fVar197 * fVar260 + fVar241;
                fVar246 = fVar222 + fVar222 + fVar242;
                fVar241 = fVar222 + fVar241 + fVar241;
                fVar242 = fVar222 + fVar242 + fVar242;
                fStack_384 = (float)local_3a8._4_4_;
                fStack_380 = fStack_3a0;
                fStack_37c = fStack_39c;
                fVar258 = (SQRT((float)local_3b8._0_4_) + 1.0) *
                          ((float)local_3a8._0_4_ / SQRT(fVar230)) +
                          SQRT((float)local_3b8._0_4_) * (float)local_3a8._0_4_ + local_388;
                fVar222 = fVar138 * fVar266;
                auVar285._0_4_ = fVar260 * fVar249;
                auVar285._4_4_ = fVar262 * fVar254;
                auVar285._8_4_ = fVar264 * fVar256;
                auVar285._12_4_ = fVar266 * -fStack_49c;
                auVar286._8_8_ = auVar285._8_8_;
                auVar286._0_8_ = auVar286._8_8_;
                auVar287._4_12_ = auVar286._4_12_;
                auVar287._0_4_ =
                     auVar285._8_4_ + auVar285._4_4_ + auVar285._0_4_ +
                     fVar153 * (fVar230 * fVar154 - fVar243 * fStack_4a0) * fVar231 * fVar221 +
                     fVar153 * (fVar230 * fVar196 - fVar243 * fStack_4a4) * fVar231 * fVar220 +
                     fVar153 * (fVar230 * fVar195 - fVar243 * local_4a8) * fVar231 * fVar197;
                fVar153 = fVar126 * fVar264 + fVar124 * fVar262 + fVar104 * fVar260;
                fVar196 = (float)local_3b8._0_4_ - fVar245 * fVar245;
                auVar92._0_8_ = CONCAT44((float)local_3b8._4_4_ - fVar246 * fVar246,fVar196);
                auVar92._8_4_ = fStack_3b0 - fVar241 * fVar241;
                auVar92._12_4_ = fStack_3ac - fVar242 * fVar242;
                fVar231 = -fStack_49c * fStack_3bc;
                local_3c8 = fVar197;
                fStack_3c4 = fVar220;
                fStack_3c0 = fVar221;
                fVar195 = fVar138 * fStack_3bc;
                fVar154 = (fVar126 * fVar221 + fVar124 * fVar220 + fVar104 * fVar197) -
                          fVar245 * fVar153;
                auVar117._8_4_ = auVar92._8_4_;
                auVar117._0_8_ = auVar92._0_8_;
                auVar117._12_4_ = auVar92._12_4_;
                auVar234 = rsqrtss(auVar117,auVar92);
                fVar230 = auVar234._0_4_;
                auVar147._0_4_ = fVar230 * 1.5 - fVar230 * fVar230 * fVar196 * 0.5 * fVar230;
                auVar147._4_12_ = auVar234._4_12_;
                if (fVar196 < 0.0) {
                  _local_418 = auVar147;
                  local_408 = fVar154;
                  fStack_404 = fVar195;
                  fStack_400 = fVar126 * fVar221;
                  fStack_3fc = fVar195;
                  local_3f8 = fVar153;
                  fStack_3f4 = fVar222;
                  fStack_3f0 = fVar126 * fVar264;
                  fStack_3ec = fVar222;
                  local_3e8 = fVar245;
                  fStack_3e4 = fVar246;
                  fStack_3e0 = fVar241;
                  fStack_3dc = fVar242;
                  _local_3d8 = auVar287;
                  fVar196 = sqrtf(fVar196);
                  auVar147 = _local_418;
                  auVar283 = local_3d8;
                  fVar230 = local_3e8;
                  fVar153 = local_3f8;
                  fVar222 = fStack_3f4;
                  fVar154 = local_408;
                  fVar195 = fStack_404;
                }
                else {
                  fVar196 = SQRT(fVar196);
                  auVar283 = (undefined1  [8])auVar287._0_8_;
                  fVar230 = fVar245;
                }
                fVar196 = fVar196 - fVar232;
                fVar197 = ((fVar256 * fVar221 + fVar254 * fVar220 + fVar249 * fVar197) -
                          fVar245 * auVar287._0_4_) * auVar147._0_4_ - fStack_49c;
                fVar154 = fVar154 * auVar147._0_4_;
                auVar148._0_4_ = SUB84(auVar283,0) * fVar154 - fVar153 * fVar197;
                auVar162._8_4_ = -fVar231;
                auVar162._0_8_ = CONCAT44(fVar231,fVar197) ^ 0x8000000000000000;
                auVar162._12_4_ = fVar195;
                auVar161._8_8_ = auVar162._8_8_;
                auVar161._0_8_ = CONCAT44(fVar154,fVar197) ^ 0x80000000;
                auVar148._4_4_ = auVar148._0_4_;
                auVar148._8_4_ = auVar148._0_4_;
                auVar148._12_4_ = auVar148._0_4_;
                auVar234 = divps(auVar161,auVar148);
                auVar289._8_4_ = (int)((ulong)auVar283 >> 0x20);
                auVar289._0_8_ = auVar283;
                auVar289._12_4_ = -fVar222;
                auVar288._8_8_ = auVar289._8_8_;
                auVar288._0_8_ = CONCAT44(fVar153,SUB84(auVar283,0)) ^ 0x8000000000000000;
                auVar174 = divps(auVar288,auVar148);
                fVar141 = fVar141 - (fVar196 * auVar174._0_4_ + fVar230 * auVar234._0_4_);
                fVar139 = fVar139 - (fVar196 * auVar174._4_4_ + fVar230 * auVar234._4_4_);
                if ((ABS(fVar230) < fVar258) &&
                   (ABS(fVar196) < local_428 * 1.9073486e-06 + local_388 + fVar258)) {
                  fVar141 = local_2d8._0_4_ + fVar141;
                  uVar45 = 0;
                  if ((fVar141 < (ray->org).field_0.m128[3]) ||
                     (((fVar104 = ray->tfar, fVar104 < fVar141 || (uVar45 = 0, fVar139 < 0.0)) ||
                      (1.0 < fVar139)))) goto LAB_00a9a67e;
                  auVar234 = rsqrtss(_local_3b8,_local_3b8);
                  fVar124 = auVar234._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar53].ptr;
                  if ((pGVar7->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (uVar45 = CONCAT71((int7)((ulong)context->args >> 8),1),
                       pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00a9a67e;
                    fVar153 = fVar124 * 1.5 + fVar124 * fVar124 * local_3b8._0_4_ * -0.5 * fVar124;
                    fVar154 = local_3c8 * fVar153;
                    fVar196 = fStack_3c4 * fVar153;
                    fVar153 = fStack_3c0 * fVar153;
                    fVar124 = fStack_49c * fVar154 + local_4a8;
                    fVar126 = fStack_49c * fVar196 + fStack_4a4;
                    fVar138 = fStack_49c * fVar153 + fStack_4a0;
                    fVar195 = fVar196 * local_4a8 - fStack_4a4 * fVar154;
                    fVar196 = fVar153 * fStack_4a4 - fStack_4a0 * fVar196;
                    fVar153 = fVar154 * fStack_4a0 - local_4a8 * fVar153;
                    local_488 = CONCAT44(fVar124 * fVar195 - fVar196 * fVar138,
                                         fVar138 * fVar153 - fVar195 * fVar126);
                    fStack_480 = fVar126 * fVar196 - fVar153 * fVar124;
                    fStack_47c = fVar139;
                    local_478 = 0;
                    local_474 = (int)local_360;
                    local_470 = uVar53;
                    local_46c = context->user->instID[0];
                    local_468 = context->user->instPrimID[0];
                    ray->tfar = fVar141;
                    local_378._0_4_ = 0xffffffff;
                    local_508.geometryUserPtr = pGVar7->userPtr;
                    local_508.valid = (int *)local_378;
                    local_508.context = context->user;
                    local_508.hit = (RTCHitN *)&local_488;
                    local_508.N = 1;
                    local_508.ray = (RTCRayN *)ray;
                    if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a9a8a5:
                      p_Var44 = context->args->filter;
                      if ((p_Var44 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var44)(&local_508);
                        p_Var44 = (RTCFilterFunctionN)local_508.valid;
                        if (*local_508.valid == 0) goto LAB_00a9a8eb;
                      }
                      uVar45 = CONCAT71((int7)((ulong)p_Var44 >> 8),1);
                      goto LAB_00a9a67e;
                    }
                    (*pGVar7->occlusionFilterN)(&local_508);
                    if (*local_508.valid != 0) goto LAB_00a9a8a5;
LAB_00a9a8eb:
                    ray->tfar = fVar104;
                  }
                  uVar45 = 0;
                  goto LAB_00a9a67e;
                }
                bVar52 = uVar42 < 4;
                uVar42 = uVar42 + 1;
              } while (uVar42 != 5);
              bVar52 = false;
              uVar45 = 5;
LAB_00a9a67e:
              fVar104 = ray->tfar;
              local_2c8._0_4_ = -(uint)(local_438 <= fVar104) & local_2c8._0_4_;
              local_2c8._4_4_ = -(uint)(fStack_434 <= fVar104) & local_2c8._4_4_;
              local_2c8._8_4_ = -(uint)(fStack_430 <= fVar104) & local_2c8._8_4_;
              local_2c8._12_4_ = -(uint)(fStack_42c <= fVar104) & local_2c8._12_4_;
              bVar50 = (bool)(bVar50 | bVar52 & (byte)uVar45);
              uVar47 = (undefined4)((ulong)uVar45 >> 0x20);
              iVar40 = movmskps((int)uVar45,local_2c8);
            } while (iVar40 != 0);
            prim = local_368;
            fVar124 = (float)local_278._0_4_;
            fVar126 = (float)local_278._4_4_;
            fVar138 = fStack_270;
            fVar139 = fStack_26c;
          }
          local_4c8._0_4_ = -(uint)((float)local_4c8._0_4_ + local_4b8 <= fVar104) & local_2f8._0_4_
          ;
          local_4c8._4_4_ =
               -(uint)((float)local_4c8._4_4_ + fStack_4b4 <= fVar104) & local_2f8._4_4_;
          fStack_4c0 = (float)(-(uint)(fStack_4c0 + fStack_4b0 <= fVar104) & (uint)fStack_2f0);
          fStack_4bc = (float)(-(uint)(fStack_4bc + fStack_4ac <= fVar104) & (uint)fStack_2ec);
          auVar119._0_4_ =
               -(uint)((int)local_308 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_548._0_4_ * fVar184 +
                                                 fVar155 * fVar140 + auVar160._0_4_ * fVar185)) &
                             local_458._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar119._4_4_ =
               -(uint)((int)fStack_304 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_548._4_4_ * fVar184 +
                                                 fVar166 * fVar140 + auVar160._4_4_ * fVar185)) &
                             local_458._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar119._8_4_ =
               -(uint)((int)fStack_300 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_540 * fVar184 +
                                                 fVar167 * fVar140 + auVar160._8_4_ * fVar185)) &
                             (uint)fStack_450) << 0x1f) >> 0x1f) + 4);
          auVar119._12_4_ =
               -(uint)((int)fStack_2fc <
                      ((int)((-(uint)(0.3 <= ABS(fStack_53c * fVar184 +
                                                 fVar168 * fVar140 + auVar160._12_4_ * fVar185)) &
                             (uint)fStack_44c) << 0x1f) >> 0x1f) + 4);
          local_378 = ~auVar119 & _local_4c8;
          iVar40 = movmskps(0,local_378);
          if (iVar40 != 0) {
            local_438 = local_4b8 + fVar124;
            fStack_434 = fStack_4b4 + fVar126;
            fStack_430 = fStack_4b0 + fVar138;
            fStack_42c = fStack_4ac + fVar139;
            do {
              uVar54 = local_378._0_4_;
              uVar55 = local_378._4_4_;
              uVar56 = local_378._8_4_;
              uVar57 = local_378._12_4_;
              auVar95._0_4_ = uVar54 & (uint)fVar124;
              auVar95._4_4_ = uVar55 & (uint)fVar126;
              auVar95._8_4_ = uVar56 & (uint)fVar138;
              auVar95._12_4_ = uVar57 & (uint)fVar139;
              auVar135._0_8_ = CONCAT44(~uVar55,~uVar54) & 0x7f8000007f800000;
              auVar135._8_4_ = ~uVar56 & 0x7f800000;
              auVar135._12_4_ = ~uVar57 & 0x7f800000;
              auVar135 = auVar135 | auVar95;
              auVar150._4_4_ = auVar135._0_4_;
              auVar150._0_4_ = auVar135._4_4_;
              auVar150._8_4_ = auVar135._12_4_;
              auVar150._12_4_ = auVar135._8_4_;
              auVar69 = minps(auVar150,auVar135);
              auVar96._0_8_ = auVar69._8_8_;
              auVar96._8_4_ = auVar69._0_4_;
              auVar96._12_4_ = auVar69._4_4_;
              auVar69 = minps(auVar96,auVar69);
              auVar97._0_8_ =
                   CONCAT44(-(uint)(auVar69._4_4_ == auVar135._4_4_) & uVar55,
                            -(uint)(auVar69._0_4_ == auVar135._0_4_) & uVar54);
              auVar97._8_4_ = -(uint)(auVar69._8_4_ == auVar135._8_4_) & uVar56;
              auVar97._12_4_ = -(uint)(auVar69._12_4_ == auVar135._12_4_) & uVar57;
              iVar40 = movmskps(iVar40,auVar97);
              auVar120 = local_378;
              if (iVar40 != 0) {
                auVar120._8_4_ = auVar97._8_4_;
                auVar120._0_8_ = auVar97._0_8_;
                auVar120._12_4_ = auVar97._12_4_;
              }
              uVar41 = movmskps(iVar40,auVar120);
              lVar43 = 0;
              if (CONCAT44(uVar47,uVar41) != 0) {
                for (; (CONCAT44(uVar47,uVar41) >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                }
              }
              *(undefined4 *)(local_378 + lVar43 * 4) = 0;
              fVar104 = (ray->dir).field_0.m128[0];
              fVar141 = (ray->dir).field_0.m128[1];
              fVar153 = (ray->dir).field_0.m128[2];
              fVar154 = (ray->dir).field_0.m128[3];
              auVar15._4_4_ = fStack_494;
              auVar15._0_4_ = local_498;
              auVar15._8_4_ = fStack_490;
              auVar15._12_4_ = fStack_48c;
              auVar20._4_4_ = fStack_314;
              auVar20._0_4_ = local_318;
              auVar20._8_4_ = fStack_310;
              auVar20._12_4_ = fStack_30c;
              auVar234 = minps(auVar15,auVar20);
              auVar174 = maxps(auVar15,auVar20);
              auVar18._4_4_ = fStack_324;
              auVar18._0_4_ = local_328;
              auVar18._8_4_ = fStack_320;
              auVar18._12_4_ = fStack_31c;
              auVar69 = minps(auVar18,auVar219);
              auVar234 = minps(auVar234,auVar69);
              auVar69 = maxps(auVar18,auVar219);
              auVar69 = maxps(auVar174,auVar69);
              auVar136._0_8_ = auVar234._0_8_ & 0x7fffffff7fffffff;
              auVar136._8_4_ = auVar234._8_4_ & 0x7fffffff;
              auVar136._12_4_ = auVar234._12_4_ & 0x7fffffff;
              local_428 = auVar69._12_4_;
              auVar98._0_8_ = auVar69._0_8_ & 0x7fffffff7fffffff;
              auVar98._8_4_ = auVar69._8_4_ & 0x7fffffff;
              auVar98._12_4_ = ABS(local_428);
              auVar69 = maxps(auVar136,auVar98);
              fVar155 = auVar69._4_4_;
              if (auVar69._4_4_ <= auVar69._0_4_) {
                fVar155 = auVar69._0_4_;
              }
              auVar137._8_8_ = auVar69._8_8_;
              auVar137._0_8_ = auVar69._8_8_;
              if (auVar69._8_4_ <= fVar155) {
                auVar137._0_4_ = fVar155;
              }
              fVar167 = auVar137._0_4_ * 1.9073486e-06;
              local_3c8 = SQRT(fVar153 * fVar153 + fVar141 * fVar141 + fVar104 * fVar104) *
                          1.9073486e-06;
              fStack_424 = local_428;
              fStack_420 = local_428;
              fStack_41c = local_428;
              fVar155 = local_118[lVar43];
              fVar166 = *(float *)(local_268 + lVar43 * 4);
              fVar168 = 0.0;
              fVar184 = 0.0;
              bVar52 = true;
              uVar42 = 0;
              do {
                fVar222 = 1.0 - fVar155;
                fVar195 = local_318 * fVar222 + local_328 * fVar155;
                fVar196 = fStack_314 * fVar222 + fStack_324 * fVar155;
                fVar221 = fStack_310 * fVar222 + fStack_320 * fVar155;
                fVar230 = fStack_30c * fVar222 + fStack_31c * fVar155;
                fVar185 = (local_498 * fVar222 + local_318 * fVar155) * fVar222 + fVar155 * fVar195;
                fVar197 = (fStack_494 * fVar222 + fStack_314 * fVar155) * fVar222 +
                          fVar155 * fVar196;
                fVar220 = (fStack_490 * fVar222 + fStack_310 * fVar155) * fVar222 +
                          fVar155 * fVar221;
                fVar140 = (fStack_48c * fVar222 + fStack_30c * fVar155) * fVar222 +
                          fVar155 * fVar230;
                fVar241 = fVar195 * fVar222 +
                          (local_328 * fVar222 + auVar219._0_4_ * fVar155) * fVar155;
                fVar243 = fVar196 * fVar222 +
                          (fStack_324 * fVar222 + auVar219._4_4_ * fVar155) * fVar155;
                fVar246 = fVar221 * fVar222 +
                          (fStack_320 * fVar222 + auVar219._8_4_ * fVar155) * fVar155;
                fVar195 = fVar230 * fVar222 +
                          (fStack_31c * fVar222 + auVar219._12_4_ * fVar155) * fVar155;
                fVar196 = fVar222 * fVar140 + fVar155 * fVar195;
                fVar242 = (fVar241 - fVar185) * 3.0;
                fVar245 = (fVar243 - fVar197) * 3.0;
                fVar249 = (fVar246 - fVar220) * 3.0;
                fVar254 = (fVar195 - fVar140) * 3.0;
                fVar230 = fVar222 * 6.0;
                fVar195 = (fVar155 - (fVar222 + fVar222)) * 6.0;
                fVar221 = (fVar222 - (fVar155 + fVar155)) * 6.0;
                fVar140 = fVar155 * 6.0;
                fVar231 = fVar230 * local_498 +
                          fVar195 * local_318 + fVar221 * local_328 + fVar140 * auVar219._0_4_;
                fVar232 = fVar230 * fStack_494 +
                          fVar195 * fStack_314 + fVar221 * fStack_324 + fVar140 * auVar219._4_4_;
                fVar221 = fVar230 * fStack_490 +
                          fVar195 * fStack_310 + fVar221 * fStack_320 + fVar140 * auVar219._8_4_;
                fVar140 = (fVar166 * fVar104 + 0.0) - (fVar222 * fVar185 + fVar155 * fVar241);
                fVar185 = (fVar166 * fVar141 + 0.0) - (fVar222 * fVar197 + fVar155 * fVar243);
                fVar195 = (fVar166 * fVar153 + 0.0) - (fVar222 * fVar220 + fVar155 * fVar246);
                fVar220 = (fVar166 * fVar154 + 0.0) - fVar196;
                fVar197 = fVar185 * fVar185;
                fStack_3d0 = fVar195 * fVar195;
                fStack_3cc = fVar220 * fVar220;
                local_3d8._0_4_ = fVar197 + fVar140 * fVar140 + fStack_3d0;
                local_3d8._4_4_ = fVar197 + fVar197 + fStack_3cc;
                fStack_3d0 = fVar197 + fStack_3d0 + fStack_3d0;
                fStack_3cc = fVar197 + fStack_3cc + fStack_3cc;
                uStack_564 = auVar137._4_4_;
                uStack_560 = auVar137._8_4_;
                uStack_55c = auVar137._12_4_;
                local_3b8._0_4_ = fVar167;
                if (fVar167 <= local_3c8 * fVar166) {
                  local_3b8._0_4_ = local_3c8 * fVar166;
                }
                fVar222 = fVar245 * fVar245 + fVar242 * fVar242 + fVar249 * fVar249;
                auVar69 = ZEXT416((uint)fVar222);
                auVar234 = rsqrtss(ZEXT416((uint)fVar222),auVar69);
                fVar197 = auVar234._0_4_;
                fVar241 = fVar197 * 1.5 - fVar197 * fVar197 * fVar222 * 0.5 * fVar197;
                fVar246 = fVar242 * fVar241;
                fVar256 = fVar245 * fVar241;
                fVar258 = fVar249 * fVar241;
                local_398._4_4_ = fVar254 * fVar241;
                fVar243 = fVar249 * fVar221 + fVar245 * fVar232 + fVar242 * fVar231;
                auVar69 = rcpss(auVar69,auVar69);
                fVar197 = (2.0 - fVar222 * auVar69._0_4_) * auVar69._0_4_;
                fVar230 = fVar185 * fVar256;
                fStack_3a0 = fVar195 * fVar258;
                fStack_39c = fVar220 * (float)local_398._4_4_;
                local_3a8._0_4_ = fVar230 + fVar140 * fVar246 + fStack_3a0;
                local_3a8._4_4_ = fVar230 + fVar230 + fStack_39c;
                fStack_3a0 = fVar230 + fStack_3a0 + fStack_3a0;
                fStack_39c = fVar230 + fStack_39c + fStack_39c;
                local_3b8._4_4_ = uStack_564;
                fStack_3b0 = (float)uStack_560;
                fStack_3ac = (float)uStack_55c;
                fVar260 = (SQRT((float)local_3d8._0_4_) + 1.0) * (fVar167 / SQRT(fVar222)) +
                          SQRT((float)local_3d8._0_4_) * fVar167 + (float)local_3b8._0_4_;
                fVar230 = fVar154 * (float)local_398._4_4_;
                fStack_390 = fVar258 * -fVar249;
                local_398._4_4_ = (float)local_398._4_4_ * -fVar254;
                local_398._0_4_ =
                     fStack_390 + fVar256 * -fVar245 + fVar246 * -fVar242 +
                     fVar197 * (fVar222 * fVar221 - fVar243 * fVar249) * fVar241 * fVar195 +
                     fVar197 * (fVar222 * fVar232 - fVar243 * fVar245) * fVar241 * fVar185 +
                     fVar197 * (fVar222 * fVar231 - fVar243 * fVar242) * fVar241 * fVar140;
                fVar222 = fVar153 * fVar258 + fVar141 * fVar256 + fVar104 * fVar246;
                fVar231 = (float)local_3d8._0_4_ - (float)local_3a8._0_4_ * (float)local_3a8._0_4_;
                fVar232 = (float)local_3d8._4_4_ - (float)local_3a8._4_4_ * (float)local_3a8._4_4_;
                fVar241 = fStack_3d0 - fStack_3a0 * fStack_3a0;
                fVar243 = fStack_3cc - fStack_39c * fStack_39c;
                fStack_380 = -fVar249 * fVar195;
                fStack_384 = -fVar254 * fVar220;
                fStack_38c = (float)local_398._4_4_;
                local_388 = (fStack_380 + -fVar245 * fVar185 + -fVar242 * fVar140) -
                            (float)local_3a8._0_4_ * (float)local_398._0_4_;
                fStack_37c = fStack_384;
                fVar221 = fVar154 * fVar220;
                fVar197 = (fVar153 * fVar195 + fVar141 * fVar185 + fVar104 * fVar140) -
                          (float)local_3a8._0_4_ * fVar222;
                auVar121._4_4_ = fVar232;
                auVar121._0_4_ = fVar231;
                auVar121._8_4_ = fVar241;
                auVar121._12_4_ = fVar243;
                auVar12._4_4_ = fVar232;
                auVar12._0_4_ = fVar231;
                auVar12._8_4_ = fVar241;
                auVar12._12_4_ = fVar243;
                auVar69 = rsqrtss(auVar121,auVar12);
                fVar232 = auVar69._0_4_;
                auVar151._0_4_ = fVar232 * 1.5 - fVar232 * fVar232 * fVar231 * 0.5 * fVar232;
                auVar151._4_12_ = auVar69._4_12_;
                local_4a8 = fVar166;
                fStack_4a4 = fVar155;
                fStack_4a0 = fVar168;
                fStack_49c = fVar184;
                if (fVar231 < 0.0) {
                  _local_418 = auVar151;
                  local_408 = fVar197;
                  fStack_404 = fVar221;
                  fStack_400 = fVar153 * fVar195;
                  fStack_3fc = fVar221;
                  local_3f8 = fVar222;
                  fStack_3f4 = fVar230;
                  fStack_3f0 = fVar153 * fVar258;
                  fStack_3ec = fVar230;
                  local_3e8 = fVar140;
                  fStack_3e4 = fVar185;
                  fStack_3e0 = fVar195;
                  fStack_3dc = fVar220;
                  fVar231 = sqrtf(fVar231);
                  auVar151 = _local_418;
                  fVar197 = local_408;
                  fVar221 = fStack_404;
                  fVar140 = local_3e8;
                  fVar185 = fStack_3e4;
                  fVar195 = fStack_3e0;
                  fVar222 = local_3f8;
                  fVar230 = fStack_3f4;
                }
                else {
                  fVar231 = SQRT(fVar231);
                }
                auVar219._4_4_ = fVar59;
                auVar219._0_4_ = fVar125;
                auVar219._8_4_ = fVar102;
                auVar219._12_4_ = fVar183;
                fVar231 = fVar231 - fVar196;
                fVar155 = local_388 * auVar151._0_4_ - fVar254;
                fVar197 = fVar197 * auVar151._0_4_;
                auVar180._0_8_ = local_398;
                auVar152._0_4_ = local_398._0_4_ * fVar197 - fVar222 * fVar155;
                auVar164._8_4_ = -fStack_384;
                auVar164._0_8_ = CONCAT44(fStack_384,fVar155) ^ 0x8000000000000000;
                auVar164._12_4_ = fVar221;
                auVar163._8_8_ = auVar164._8_8_;
                auVar163._0_8_ = CONCAT44(fVar197,fVar155) ^ 0x80000000;
                auVar152._4_4_ = auVar152._0_4_;
                auVar152._8_4_ = auVar152._0_4_;
                auVar152._12_4_ = auVar152._0_4_;
                auVar69 = divps(auVar163,auVar152);
                auVar180._8_4_ = local_398._4_4_;
                auVar180._12_4_ = -fVar230;
                auVar179._8_8_ = auVar180._8_8_;
                auVar179._0_8_ = CONCAT44(fVar222,local_398._0_4_) ^ 0x8000000000000000;
                auVar234 = divps(auVar179,auVar152);
                fVar166 = local_4a8 -
                          (fVar231 * auVar234._0_4_ + (float)local_3a8._0_4_ * auVar69._0_4_);
                fVar155 = fStack_4a4 -
                          (fVar231 * auVar234._4_4_ + (float)local_3a8._0_4_ * auVar69._4_4_);
                fVar168 = fStack_4a0 -
                          (fVar231 * auVar234._8_4_ + (float)local_3a8._0_4_ * auVar69._8_4_);
                fVar184 = fStack_49c -
                          (fVar231 * auVar234._12_4_ + (float)local_3a8._0_4_ * auVar69._12_4_);
                if ((ABS((float)local_3a8._0_4_) < fVar260) &&
                   (ABS(fVar231) < local_428 * 1.9073486e-06 + (float)local_3b8._0_4_ + fVar260)) {
                  fVar166 = local_2d8._0_4_ + fVar166;
                  uVar45 = 0;
                  if ((fVar166 < (ray->org).field_0.m128[3]) ||
                     (((fVar104 = ray->tfar, fVar104 < fVar166 || (uVar45 = 0, fVar155 < 0.0)) ||
                      (1.0 < fVar155)))) goto LAB_00a9b0fa;
                  auVar69 = rsqrtss(_local_3d8,_local_3d8);
                  fVar141 = auVar69._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar53].ptr;
                  if ((pGVar7->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (uVar45 = CONCAT71((int7)((ulong)context->args >> 8),1),
                       pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00a9b0fa;
                    fVar141 = fVar141 * 1.5 + fVar141 * fVar141 * local_3d8._0_4_ * -0.5 * fVar141;
                    fVar140 = fVar140 * fVar141;
                    fVar185 = fVar185 * fVar141;
                    fVar195 = fVar195 * fVar141;
                    fVar141 = fVar254 * fVar140 + fVar242;
                    fVar153 = fVar254 * fVar185 + fVar245;
                    fVar154 = fVar254 * fVar195 + fVar249;
                    fVar167 = fVar185 * fVar242 - fVar245 * fVar140;
                    fVar168 = fVar195 * fVar245 - fVar249 * fVar185;
                    fVar184 = fVar140 * fVar249 - fVar242 * fVar195;
                    local_488 = CONCAT44(fVar141 * fVar167 - fVar168 * fVar154,
                                         fVar154 * fVar184 - fVar167 * fVar153);
                    fStack_480 = fVar153 * fVar168 - fVar184 * fVar141;
                    fStack_47c = fVar155;
                    local_478 = 0;
                    local_474 = (int)local_360;
                    local_470 = uVar53;
                    local_46c = context->user->instID[0];
                    local_468 = context->user->instPrimID[0];
                    ray->tfar = fVar166;
                    local_50c = 0xffffffff;
                    local_508.geometryUserPtr = pGVar7->userPtr;
                    local_508.valid = &local_50c;
                    local_508.context = context->user;
                    local_508.hit = (RTCHitN *)&local_488;
                    local_508.N = 1;
                    local_508.ray = (RTCRayN *)ray;
                    if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a9b334:
                      p_Var44 = context->args->filter;
                      if ((p_Var44 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var44)(&local_508);
                        p_Var44 = (RTCFilterFunctionN)local_508.valid;
                        if (*local_508.valid == 0) goto LAB_00a9b37f;
                      }
                      uVar45 = CONCAT71((int7)((ulong)p_Var44 >> 8),1);
                      goto LAB_00a9b0fa;
                    }
                    (*pGVar7->occlusionFilterN)(&local_508);
                    if (*local_508.valid != 0) goto LAB_00a9b334;
LAB_00a9b37f:
                    ray->tfar = fVar104;
                  }
                  uVar45 = 0;
                  goto LAB_00a9b0fa;
                }
                bVar52 = uVar42 < 4;
                uVar42 = uVar42 + 1;
              } while (uVar42 != 5);
              bVar52 = false;
              uVar45 = 5;
LAB_00a9b0fa:
              fVar104 = ray->tfar;
              local_378._0_4_ = -(uint)(local_438 <= fVar104) & local_378._0_4_;
              local_378._4_4_ = -(uint)(fStack_434 <= fVar104) & local_378._4_4_;
              local_378._8_4_ = -(uint)(fStack_430 <= fVar104) & local_378._8_4_;
              local_378._12_4_ = -(uint)(fStack_42c <= fVar104) & local_378._12_4_;
              bVar50 = (bool)(bVar50 | bVar52 & (byte)uVar45);
              uVar47 = (undefined4)((ulong)uVar45 >> 0x20);
              iVar40 = movmskps((int)uVar45,local_378);
            } while (iVar40 != 0);
            iVar40 = 0;
            prim = local_368;
            fVar124 = (float)local_278._0_4_;
            fVar126 = (float)local_278._4_4_;
            fVar138 = fStack_270;
            fVar139 = fStack_26c;
          }
          auVar165._0_4_ =
               local_4d8._0_4_ & local_2e8._0_4_ &
               -(uint)(local_4b8 + (float)local_138._0_4_ <= fVar104);
          auVar165._4_4_ =
               local_4d8._4_4_ & local_2e8._4_4_ &
               -(uint)(fStack_4b4 + (float)local_138._4_4_ <= fVar104);
          auVar165._8_4_ =
               (uint)fStack_4d0 & (uint)fStack_2e0 & -(uint)(fStack_4b0 + fStack_130 <= fVar104);
          auVar165._12_4_ =
               (uint)fStack_4cc & (uint)fStack_2dc & -(uint)(fStack_4ac + fStack_12c <= fVar104);
          auVar99._0_4_ = auVar119._0_4_ & local_4c8._0_4_ & -(uint)(local_4b8 + fVar124 <= fVar104)
          ;
          auVar99._4_4_ =
               auVar119._4_4_ & local_4c8._4_4_ & -(uint)(fStack_4b4 + fVar126 <= fVar104);
          auVar99._8_4_ =
               auVar119._8_4_ & (uint)fStack_4c0 & -(uint)(fStack_4b0 + fVar138 <= fVar104);
          auVar99._12_4_ =
               auVar119._12_4_ & (uint)fStack_4bc & -(uint)(fStack_4ac + fVar139 <= fVar104);
          uVar54 = movmskps(iVar40,auVar99 | auVar165);
          pauVar46 = (undefined1 (*) [16])(ulong)uVar54;
          if (uVar54 != 0) {
            pauVar46 = (undefined1 (*) [16])(uVar49 * 0x30);
            *(undefined1 (*) [16])(auStack_f8 + (long)pauVar46) = auVar99 | auVar165;
            auStack_e8[uVar49 * 0xc] =
                 ~auVar165._0_4_ & (uint)fVar124 | local_138._0_4_ & auVar165._0_4_;
            *(uint *)(&stack0x0000000c + (long)pauVar46[-0xf]) =
                 ~auVar165._4_4_ & (uint)fVar126 | local_138._4_4_ & auVar165._4_4_;
            *(uint *)(&stack0x00000000 + (long)pauVar46[-0xe]) =
                 ~auVar165._8_4_ & (uint)fVar138 | (uint)fStack_130 & auVar165._8_4_;
            *(uint *)(&stack0x00000004 + (long)pauVar46[-0xe]) =
                 ~auVar165._12_4_ & (uint)fVar139 | (uint)fStack_12c & auVar165._12_4_;
            (&uStack_d8)[uVar49 * 6] = CONCAT44(fStack_1c4,local_1c8);
            aiStack_d0[uVar49 * 0xc] = local_5bc + 1;
            iVar51 = iVar51 + 1;
          }
        }
      }
    }
    fVar168 = fStack_32c;
    fVar167 = fStack_330;
    fVar166 = fStack_334;
    fVar155 = local_338;
    fVar154 = fStack_33c;
    fVar153 = fStack_340;
    fVar141 = fStack_344;
    fVar139 = local_348;
    fVar138 = fStack_34c;
    fVar126 = fStack_350;
    fVar124 = fStack_354;
    fVar104 = local_358;
    fVar184 = ray->tfar;
    if (iVar51 == 0) break;
    uVar55 = -iVar51;
    pauVar46 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar51 - 1) * 0x30);
    uVar54 = uVar55;
    while( true ) {
      local_508.valid._0_4_ =
           -(uint)(local_4b8 + *(float *)pauVar46[1] <= fVar184) & *(uint *)*pauVar46;
      local_508.valid._4_4_ =
           -(uint)(fStack_4b4 + *(float *)(pauVar46[1] + 4) <= fVar184) & *(uint *)(*pauVar46 + 4);
      local_508.geometryUserPtr._0_4_ =
           -(uint)(fStack_4b0 + *(float *)(pauVar46[1] + 8) <= fVar184) & *(uint *)(*pauVar46 + 8);
      local_508.geometryUserPtr._4_4_ =
           -(uint)(fStack_4ac + *(float *)(pauVar46[1] + 0xc) <= fVar184) &
           *(uint *)(*pauVar46 + 0xc);
      iVar40 = movmskps(uVar55,(undefined1  [16])local_508._0_16_);
      if (iVar40 != 0) break;
      pauVar46 = pauVar46 + -3;
      uVar54 = uVar54 + 1;
      uVar55 = 0;
      if (uVar54 == 0) goto LAB_00a9b575;
    }
    auVar133._0_4_ = (uint)*(float *)pauVar46[1] & (uint)local_508.valid;
    auVar133._4_4_ = (uint)*(float *)(pauVar46[1] + 4) & local_508.valid._4_4_;
    auVar133._8_4_ = (uint)*(float *)(pauVar46[1] + 8) & (uint)local_508.geometryUserPtr;
    auVar133._12_4_ = (uint)*(float *)(pauVar46[1] + 0xc) & local_508.geometryUserPtr._4_4_;
    auVar149._0_8_ = CONCAT44(~local_508.valid._4_4_,~(uint)local_508.valid) & 0x7f8000007f800000;
    auVar149._8_4_ = ~(uint)local_508.geometryUserPtr & 0x7f800000;
    auVar149._12_4_ = ~local_508.geometryUserPtr._4_4_ & 0x7f800000;
    auVar149 = auVar149 | auVar133;
    auVar134._4_4_ = auVar149._0_4_;
    auVar134._0_4_ = auVar149._4_4_;
    auVar134._8_4_ = auVar149._12_4_;
    auVar134._12_4_ = auVar149._8_4_;
    auVar69 = minps(auVar134,auVar149);
    auVar93._0_8_ = auVar69._8_8_;
    auVar93._8_4_ = auVar69._0_4_;
    auVar93._12_4_ = auVar69._4_4_;
    auVar69 = minps(auVar93,auVar69);
    auVar94._0_8_ =
         CONCAT44(-(uint)(auVar69._4_4_ == auVar149._4_4_) & local_508.valid._4_4_,
                  -(uint)(auVar69._0_4_ == auVar149._0_4_) & (uint)local_508.valid);
    auVar94._8_4_ = -(uint)(auVar69._8_4_ == auVar149._8_4_) & (uint)local_508.geometryUserPtr;
    auVar94._12_4_ = -(uint)(auVar69._12_4_ == auVar149._12_4_) & local_508.geometryUserPtr._4_4_;
    iVar40 = movmskps(iVar40,auVar94);
    auVar118 = (undefined1  [16])local_508._0_16_;
    if (iVar40 != 0) {
      auVar118._8_4_ = auVar94._8_4_;
      auVar118._0_8_ = auVar94._0_8_;
      auVar118._12_4_ = auVar94._12_4_;
    }
    uVar45 = *(undefined8 *)pauVar46[2];
    local_5bc = *(int *)(pauVar46[2] + 8);
    uVar55 = movmskps(local_5bc,auVar118);
    lVar43 = 0;
    if (uVar55 != 0) {
      for (; (uVar55 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
      }
    }
    *(undefined4 *)((long)&local_508.valid + lVar43 * 4) = 0;
    *pauVar46 = (undefined1  [16])local_508._0_16_;
    iVar40 = movmskps((int)pauVar46,(undefined1  [16])local_508._0_16_);
    uVar42 = CONCAT44((int)((ulong)pauVar46 >> 0x20),iVar40);
    uVar55 = ~uVar54;
    if (iVar40 != 0) {
      uVar55 = -uVar54;
    }
    uVar49 = (ulong)uVar55;
    fVar184 = (float)uVar45;
    fVar140 = (float)((ulong)uVar45 >> 0x20) - fVar184;
    local_488 = CONCAT44(fVar140 * 0.33333334 + fVar184,fVar140 * 0.0 + fVar184);
    fStack_480 = fVar140 * 0.6666667 + fVar184;
    fStack_47c = fVar140 * 1.0 + fVar184;
    local_1c8 = *(float *)((long)&local_488 + lVar43 * 4);
    fStack_1c4 = *(float *)((long)&local_488 + lVar43 * 4 + 4);
  } while( true );
LAB_00a9b575:
  if (bVar50 != false) {
    return bVar50;
  }
  auVar123._4_4_ = -(uint)(fStack_254 <= fVar184);
  auVar123._0_4_ = -(uint)(local_258 <= fVar184);
  auVar123._8_4_ = -(uint)(fStack_250 <= fVar184);
  auVar123._12_4_ = -(uint)(fStack_24c <= fVar184);
  uVar53 = movmskps((int)pauVar46,auVar123);
  uVar53 = (uint)uVar48 & uVar53;
  if (uVar53 == 0) {
    return false;
  }
  goto LAB_00a9905e;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }